

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::sse2::CurveNiIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Vec3ff *pVVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  Primitive *pPVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined6 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  int iVar45;
  undefined4 uVar46;
  ulong uVar47;
  long lVar48;
  RayHit *extraout_RAX;
  RayHit *extraout_RAX_00;
  RayHit *extraout_RAX_01;
  RayHit *extraout_RAX_02;
  RayHit *pRVar49;
  undefined4 uVar51;
  RayHit *extraout_RAX_03;
  RayHit *extraout_RAX_04;
  RayHit *extraout_RAX_05;
  RayHit *extraout_RAX_06;
  RayHit *pRVar50;
  ulong uVar52;
  RTCIntersectArguments *pRVar53;
  ulong uVar54;
  long lVar55;
  bool bVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  short sVar61;
  float fVar62;
  float fVar100;
  float fVar101;
  __m128 a_1;
  undefined2 uVar99;
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar102;
  float fVar116;
  float fVar117;
  vfloat4 v;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar118;
  float fVar119;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar134;
  float fVar151;
  float fVar152;
  vfloat4 v_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar153;
  float fVar171;
  float fVar172;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar173;
  float fVar180;
  float fVar181;
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar182;
  float fVar198;
  float fVar199;
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar224;
  float fVar225;
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float t_1;
  float fVar226;
  float fVar234;
  float fVar235;
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  float fVar241;
  float fVar242;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar243;
  float fVar248;
  float fVar249;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar260;
  float fVar264;
  float fVar265;
  vfloat4 a;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float s;
  RTCFilterFunctionNArguments args;
  vfloatx vu0;
  vfloatx u_outer1;
  vfloatx u_outer0;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined4 local_5cc;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  RTCIntersectArguments *local_560;
  undefined1 local_558 [8];
  float fStack_550;
  undefined4 uStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [16];
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 local_4e8;
  ulong local_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  RTCFilterFunctionNArguments local_4a8;
  ulong local_470;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined8 local_428;
  float fStack_420;
  float fStack_41c;
  undefined4 local_418;
  uint local_414;
  uint local_410;
  uint local_40c;
  uint local_408;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  ulong local_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8 [6];
  Primitive *local_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint auStack_f8 [4];
  float afStack_e8 [6];
  float afStack_d0 [40];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 uVar98;
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  
  PVar7 = prim[1];
  uVar52 = (ulong)(byte)PVar7;
  pPVar6 = prim + uVar52 * 0x19 + 6;
  fVar117 = *(float *)(pPVar6 + 0xc);
  fVar134 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar6) * fVar117;
  fVar151 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar6 + 4)) * fVar117;
  fVar152 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar6 + 8)) * fVar117;
  fVar102 = fVar117 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar116 = fVar117 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar117 = fVar117 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar51 = *(undefined4 *)(prim + uVar52 * 4 + 6);
  uVar98 = (undefined1)((uint)uVar51 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar51 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar51));
  uVar98 = (undefined1)((uint)uVar51 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar98),uVar98);
  sVar61 = CONCAT11((char)uVar51,(char)uVar51);
  uVar54 = CONCAT62(uVar29,sVar61);
  auVar238._8_4_ = 0;
  auVar238._0_8_ = uVar54;
  auVar238._12_2_ = uVar99;
  auVar238._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar221._12_4_ = auVar238._12_4_;
  auVar221._8_2_ = 0;
  auVar221._0_8_ = uVar54;
  auVar221._10_2_ = uVar99;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = uVar99;
  auVar220._0_8_ = uVar54;
  uVar99 = (undefined2)uVar29;
  auVar30._4_8_ = auVar220._8_8_;
  auVar30._2_2_ = uVar99;
  auVar30._0_2_ = uVar99;
  fVar118 = (float)((int)sVar61 >> 8);
  fVar131 = (float)(auVar30._0_4_ >> 0x18);
  fVar132 = (float)(auVar220._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + uVar52 * 5 + 6);
  uVar98 = (undefined1)((uint)uVar51 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar51 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar51));
  uVar98 = (undefined1)((uint)uVar51 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar98),uVar98);
  sVar61 = CONCAT11((char)uVar51,(char)uVar51);
  uVar54 = CONCAT62(uVar29,sVar61);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar54;
  auVar65._12_2_ = uVar99;
  auVar65._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar54;
  auVar64._10_2_ = uVar99;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar99;
  auVar63._0_8_ = uVar54;
  uVar99 = (undefined2)uVar29;
  auVar31._4_8_ = auVar63._8_8_;
  auVar31._2_2_ = uVar99;
  auVar31._0_2_ = uVar99;
  fVar153 = (float)((int)sVar61 >> 8);
  fVar171 = (float)(auVar31._0_4_ >> 0x18);
  fVar172 = (float)(auVar63._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + uVar52 * 6 + 6);
  uVar98 = (undefined1)((uint)uVar51 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar51 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar51));
  uVar98 = (undefined1)((uint)uVar51 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar98),uVar98);
  sVar61 = CONCAT11((char)uVar51,(char)uVar51);
  uVar54 = CONCAT62(uVar29,sVar61);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar54;
  auVar68._12_2_ = uVar99;
  auVar68._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar54;
  auVar67._10_2_ = uVar99;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar99;
  auVar66._0_8_ = uVar54;
  uVar99 = (undefined2)uVar29;
  auVar32._4_8_ = auVar66._8_8_;
  auVar32._2_2_ = uVar99;
  auVar32._0_2_ = uVar99;
  fVar173 = (float)((int)sVar61 >> 8);
  fVar180 = (float)(auVar32._0_4_ >> 0x18);
  fVar181 = (float)(auVar66._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + uVar52 * 0xb + 6);
  uVar98 = (undefined1)((uint)uVar51 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar51 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar51));
  uVar98 = (undefined1)((uint)uVar51 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar98),uVar98);
  sVar61 = CONCAT11((char)uVar51,(char)uVar51);
  uVar54 = CONCAT62(uVar29,sVar61);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar54;
  auVar71._12_2_ = uVar99;
  auVar71._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar54;
  auVar70._10_2_ = uVar99;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar99;
  auVar69._0_8_ = uVar54;
  uVar99 = (undefined2)uVar29;
  auVar33._4_8_ = auVar69._8_8_;
  auVar33._2_2_ = uVar99;
  auVar33._0_2_ = uVar99;
  fVar62 = (float)((int)sVar61 >> 8);
  fVar100 = (float)(auVar33._0_4_ >> 0x18);
  fVar101 = (float)(auVar69._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  uVar98 = (undefined1)((uint)uVar51 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar51 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar51));
  uVar98 = (undefined1)((uint)uVar51 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar98),uVar98);
  sVar61 = CONCAT11((char)uVar51,(char)uVar51);
  uVar54 = CONCAT62(uVar29,sVar61);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar54;
  auVar185._12_2_ = uVar99;
  auVar185._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar54;
  auVar184._10_2_ = uVar99;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar99;
  auVar183._0_8_ = uVar54;
  uVar99 = (undefined2)uVar29;
  auVar34._4_8_ = auVar183._8_8_;
  auVar34._2_2_ = uVar99;
  auVar34._0_2_ = uVar99;
  fVar182 = (float)((int)sVar61 >> 8);
  fVar198 = (float)(auVar34._0_4_ >> 0x18);
  fVar199 = (float)(auVar183._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + (uint)(byte)PVar7 * 0xc + uVar52 + 6);
  uVar98 = (undefined1)((uint)uVar51 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar51 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar51));
  uVar98 = (undefined1)((uint)uVar51 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar98),uVar98);
  sVar61 = CONCAT11((char)uVar51,(char)uVar51);
  uVar54 = CONCAT62(uVar29,sVar61);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar54;
  auVar203._12_2_ = uVar99;
  auVar203._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar54;
  auVar202._10_2_ = uVar99;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar99;
  auVar201._0_8_ = uVar54;
  uVar99 = (undefined2)uVar29;
  auVar35._4_8_ = auVar201._8_8_;
  auVar35._2_2_ = uVar99;
  auVar35._0_2_ = uVar99;
  fVar236 = (float)((int)sVar61 >> 8);
  fVar241 = (float)(auVar35._0_4_ >> 0x18);
  fVar242 = (float)(auVar201._8_4_ >> 0x18);
  uVar47 = (ulong)(uint)((int)(uVar52 * 9) * 2);
  uVar51 = *(undefined4 *)(prim + uVar47 + 6);
  uVar98 = (undefined1)((uint)uVar51 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar51 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar51));
  uVar98 = (undefined1)((uint)uVar51 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar98),uVar98);
  sVar61 = CONCAT11((char)uVar51,(char)uVar51);
  uVar54 = CONCAT62(uVar29,sVar61);
  auVar206._8_4_ = 0;
  auVar206._0_8_ = uVar54;
  auVar206._12_2_ = uVar99;
  auVar206._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar54;
  auVar205._10_2_ = uVar99;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._8_2_ = uVar99;
  auVar204._0_8_ = uVar54;
  uVar99 = (undefined2)uVar29;
  auVar36._4_8_ = auVar204._8_8_;
  auVar36._2_2_ = uVar99;
  auVar36._0_2_ = uVar99;
  fVar226 = (float)((int)sVar61 >> 8);
  fVar234 = (float)(auVar36._0_4_ >> 0x18);
  fVar235 = (float)(auVar204._8_4_ >> 0x18);
  uVar51 = *(undefined4 *)(prim + uVar47 + uVar52 + 6);
  uVar98 = (undefined1)((uint)uVar51 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar51 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar51));
  uVar98 = (undefined1)((uint)uVar51 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar98),uVar98);
  sVar61 = CONCAT11((char)uVar51,(char)uVar51);
  uVar54 = CONCAT62(uVar29,sVar61);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar54;
  auVar209._12_2_ = uVar99;
  auVar209._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar54;
  auVar208._10_2_ = uVar99;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar99;
  auVar207._0_8_ = uVar54;
  uVar99 = (undefined2)uVar29;
  auVar37._4_8_ = auVar207._8_8_;
  auVar37._2_2_ = uVar99;
  auVar37._0_2_ = uVar99;
  fVar243 = (float)((int)sVar61 >> 8);
  fVar248 = (float)(auVar37._0_4_ >> 0x18);
  fVar249 = (float)(auVar207._8_4_ >> 0x18);
  uVar47 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  uVar51 = *(undefined4 *)(prim + uVar47 + 6);
  uVar98 = (undefined1)((uint)uVar51 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar51 >> 0x10);
  uVar13 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar51));
  uVar98 = (undefined1)((uint)uVar51 >> 8);
  uVar29 = CONCAT51(CONCAT41((int)((ulong)uVar13 >> 0x20),uVar98),uVar98);
  sVar61 = CONCAT11((char)uVar51,(char)uVar51);
  uVar54 = CONCAT62(uVar29,sVar61);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar54;
  auVar212._12_2_ = uVar99;
  auVar212._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar13 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar54;
  auVar211._10_2_ = uVar99;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar99;
  auVar210._0_8_ = uVar54;
  uVar99 = (undefined2)uVar29;
  auVar38._4_8_ = auVar210._8_8_;
  auVar38._2_2_ = uVar99;
  auVar38._0_2_ = uVar99;
  fVar260 = (float)((int)sVar61 >> 8);
  fVar264 = (float)(auVar38._0_4_ >> 0x18);
  fVar265 = (float)(auVar210._8_4_ >> 0x18);
  fVar254 = fVar102 * fVar118 + fVar116 * fVar153 + fVar117 * fVar173;
  fVar257 = fVar102 * fVar131 + fVar116 * fVar171 + fVar117 * fVar180;
  fVar258 = fVar102 * fVar132 + fVar116 * fVar172 + fVar117 * fVar181;
  fVar259 = fVar102 * (float)(auVar221._12_4_ >> 0x18) +
            fVar116 * (float)(auVar64._12_4_ >> 0x18) + fVar117 * (float)(auVar67._12_4_ >> 0x18);
  fVar250 = fVar102 * fVar62 + fVar116 * fVar182 + fVar117 * fVar236;
  fVar251 = fVar102 * fVar100 + fVar116 * fVar198 + fVar117 * fVar241;
  fVar252 = fVar102 * fVar101 + fVar116 * fVar199 + fVar117 * fVar242;
  fVar253 = fVar102 * (float)(auVar70._12_4_ >> 0x18) +
            fVar116 * (float)(auVar184._12_4_ >> 0x18) + fVar117 * (float)(auVar202._12_4_ >> 0x18);
  fVar200 = fVar102 * fVar226 + fVar116 * fVar243 + fVar117 * fVar260;
  fVar224 = fVar102 * fVar234 + fVar116 * fVar248 + fVar117 * fVar264;
  fVar225 = fVar102 * fVar235 + fVar116 * fVar249 + fVar117 * fVar265;
  fVar102 = fVar102 * (float)(auVar205._12_4_ >> 0x18) +
            fVar116 * (float)(auVar208._12_4_ >> 0x18) + fVar117 * (float)(auVar211._12_4_ >> 0x18);
  fVar119 = fVar118 * fVar134 + fVar153 * fVar151 + fVar173 * fVar152;
  fVar180 = fVar131 * fVar134 + fVar171 * fVar151 + fVar180 * fVar152;
  fVar181 = fVar132 * fVar134 + fVar172 * fVar151 + fVar181 * fVar152;
  fVar133 = (float)(auVar221._12_4_ >> 0x18) * fVar134 +
            (float)(auVar64._12_4_ >> 0x18) * fVar151 + (float)(auVar67._12_4_ >> 0x18) * fVar152;
  fVar182 = fVar62 * fVar134 + fVar182 * fVar151 + fVar236 * fVar152;
  fVar198 = fVar100 * fVar134 + fVar198 * fVar151 + fVar241 * fVar152;
  fVar199 = fVar101 * fVar134 + fVar199 * fVar151 + fVar242 * fVar152;
  fVar236 = (float)(auVar70._12_4_ >> 0x18) * fVar134 +
            (float)(auVar184._12_4_ >> 0x18) * fVar151 + (float)(auVar202._12_4_ >> 0x18) * fVar152;
  fVar153 = fVar134 * fVar226 + fVar151 * fVar243 + fVar152 * fVar260;
  fVar171 = fVar134 * fVar234 + fVar151 * fVar248 + fVar152 * fVar264;
  fVar172 = fVar134 * fVar235 + fVar151 * fVar249 + fVar152 * fVar265;
  fVar173 = fVar134 * (float)(auVar205._12_4_ >> 0x18) +
            fVar151 * (float)(auVar208._12_4_ >> 0x18) + fVar152 * (float)(auVar211._12_4_ >> 0x18);
  fVar117 = (float)DAT_01ff1d40;
  fVar62 = DAT_01ff1d40._4_4_;
  fVar100 = DAT_01ff1d40._8_4_;
  fVar101 = DAT_01ff1d40._12_4_;
  uVar57 = -(uint)(fVar117 <= ABS(fVar254));
  uVar58 = -(uint)(fVar62 <= ABS(fVar257));
  uVar59 = -(uint)(fVar100 <= ABS(fVar258));
  uVar60 = -(uint)(fVar101 <= ABS(fVar259));
  auVar255._0_4_ = (uint)fVar254 & uVar57;
  auVar255._4_4_ = (uint)fVar257 & uVar58;
  auVar255._8_4_ = (uint)fVar258 & uVar59;
  auVar255._12_4_ = (uint)fVar259 & uVar60;
  auVar135._0_4_ = ~uVar57 & (uint)fVar117;
  auVar135._4_4_ = ~uVar58 & (uint)fVar62;
  auVar135._8_4_ = ~uVar59 & (uint)fVar100;
  auVar135._12_4_ = ~uVar60 & (uint)fVar101;
  auVar135 = auVar135 | auVar255;
  uVar57 = -(uint)(fVar117 <= ABS(fVar250));
  uVar58 = -(uint)(fVar62 <= ABS(fVar251));
  uVar59 = -(uint)(fVar100 <= ABS(fVar252));
  uVar60 = -(uint)(fVar101 <= ABS(fVar253));
  auVar154._0_4_ = ~uVar57 & (uint)fVar117;
  auVar154._4_4_ = ~uVar58 & (uint)fVar62;
  auVar154._8_4_ = ~uVar59 & (uint)fVar100;
  auVar154._12_4_ = ~uVar60 & (uint)fVar101;
  auVar72._4_4_ = (uint)fVar251 & uVar58;
  auVar72._0_4_ = (uint)fVar250 & uVar57;
  auVar72._8_4_ = (uint)fVar252 & uVar59;
  auVar72._12_4_ = (uint)fVar253 & uVar60;
  auVar154 = auVar154 | auVar72;
  uVar57 = -(uint)(fVar117 <= ABS(fVar200));
  uVar58 = -(uint)(fVar62 <= ABS(fVar224));
  uVar59 = -(uint)(fVar100 <= ABS(fVar225));
  uVar60 = -(uint)(fVar101 <= ABS(fVar102));
  auVar213._0_4_ = (uint)fVar200 & uVar57;
  auVar213._4_4_ = (uint)fVar224 & uVar58;
  auVar213._8_4_ = (uint)fVar225 & uVar59;
  auVar213._12_4_ = (uint)fVar102 & uVar60;
  auVar186._0_4_ = ~uVar57 & (uint)fVar117;
  auVar186._4_4_ = ~uVar58 & (uint)fVar62;
  auVar186._8_4_ = ~uVar59 & (uint)fVar100;
  auVar186._12_4_ = ~uVar60 & (uint)fVar101;
  auVar186 = auVar186 | auVar213;
  auVar72 = rcpps(_DAT_01ff1d40,auVar135);
  fVar117 = auVar72._0_4_;
  fVar101 = auVar72._4_4_;
  fVar118 = auVar72._8_4_;
  fVar134 = auVar72._12_4_;
  fVar117 = (1.0 - auVar135._0_4_ * fVar117) * fVar117 + fVar117;
  fVar101 = (1.0 - auVar135._4_4_ * fVar101) * fVar101 + fVar101;
  fVar118 = (1.0 - auVar135._8_4_ * fVar118) * fVar118 + fVar118;
  fVar134 = (1.0 - auVar135._12_4_ * fVar134) * fVar134 + fVar134;
  auVar72 = rcpps(auVar72,auVar154);
  fVar62 = auVar72._0_4_;
  fVar102 = auVar72._4_4_;
  fVar131 = auVar72._8_4_;
  fVar151 = auVar72._12_4_;
  fVar62 = (1.0 - auVar154._0_4_ * fVar62) * fVar62 + fVar62;
  fVar102 = (1.0 - auVar154._4_4_ * fVar102) * fVar102 + fVar102;
  fVar131 = (1.0 - auVar154._8_4_ * fVar131) * fVar131 + fVar131;
  fVar151 = (1.0 - auVar154._12_4_ * fVar151) * fVar151 + fVar151;
  auVar72 = rcpps(auVar72,auVar186);
  fVar100 = auVar72._0_4_;
  fVar116 = auVar72._4_4_;
  fVar132 = auVar72._8_4_;
  fVar152 = auVar72._12_4_;
  fVar100 = (1.0 - auVar186._0_4_ * fVar100) * fVar100 + fVar100;
  fVar116 = (1.0 - auVar186._4_4_ * fVar116) * fVar116 + fVar116;
  fVar132 = (1.0 - auVar186._8_4_ * fVar132) * fVar132 + fVar132;
  fVar152 = (1.0 - auVar186._12_4_ * fVar152) * fVar152 + fVar152;
  uVar54 = *(ulong *)(prim + uVar52 * 7 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar54;
  auVar75._12_2_ = uVar99;
  auVar75._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar54;
  auVar74._10_2_ = uVar99;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar99;
  auVar73._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar39._4_8_ = auVar73._8_8_;
  auVar39._2_2_ = uVar99;
  auVar39._0_2_ = uVar99;
  auVar136._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar180) * fVar101,
                ((float)(int)(short)uVar54 - fVar119) * fVar117);
  auVar136._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar181) * fVar118;
  auVar136._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar133) * fVar134;
  uVar54 = *(ulong *)(prim + uVar52 * 9 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar54;
  auVar78._12_2_ = uVar99;
  auVar78._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar54;
  auVar77._10_2_ = uVar99;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar99;
  auVar76._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar40._4_8_ = auVar76._8_8_;
  auVar40._2_2_ = uVar99;
  auVar40._0_2_ = uVar99;
  auVar187._0_4_ = ((float)(int)(short)uVar54 - fVar119) * fVar117;
  auVar187._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar180) * fVar101;
  auVar187._8_4_ = ((float)(auVar76._8_4_ >> 0x10) - fVar181) * fVar118;
  auVar187._12_4_ = ((float)(auVar77._12_4_ >> 0x10) - fVar133) * fVar134;
  lVar48 = uVar47 + uVar52;
  uVar54 = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  uVar47 = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar52 * -2 + 6);
  uVar99 = (undefined2)(uVar47 >> 0x30);
  auVar216._8_4_ = 0;
  auVar216._0_8_ = uVar47;
  auVar216._12_2_ = uVar99;
  auVar216._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar47 >> 0x20);
  auVar215._12_4_ = auVar216._12_4_;
  auVar215._8_2_ = 0;
  auVar215._0_8_ = uVar47;
  auVar215._10_2_ = uVar99;
  auVar214._10_6_ = auVar215._10_6_;
  auVar214._8_2_ = uVar99;
  auVar214._0_8_ = uVar47;
  uVar99 = (undefined2)(uVar47 >> 0x10);
  auVar41._4_8_ = auVar214._8_8_;
  auVar41._2_2_ = uVar99;
  auVar41._0_2_ = uVar99;
  auVar217._0_8_ =
       CONCAT44(((float)(auVar41._0_4_ >> 0x10) - fVar198) * fVar102,
                ((float)(int)(short)uVar47 - fVar182) * fVar62);
  auVar217._8_4_ = ((float)(auVar214._8_4_ >> 0x10) - fVar199) * fVar131;
  auVar217._12_4_ = ((float)(auVar215._12_4_ >> 0x10) - fVar236) * fVar151;
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar54;
  auVar81._12_2_ = uVar99;
  auVar81._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar54;
  auVar80._10_2_ = uVar99;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar99;
  auVar79._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar42._4_8_ = auVar79._8_8_;
  auVar42._2_2_ = uVar99;
  auVar42._0_2_ = uVar99;
  auVar82._0_4_ = ((float)(int)(short)uVar54 - fVar182) * fVar62;
  auVar82._4_4_ = ((float)(auVar42._0_4_ >> 0x10) - fVar198) * fVar102;
  auVar82._8_4_ = ((float)(auVar79._8_4_ >> 0x10) - fVar199) * fVar131;
  auVar82._12_4_ = ((float)(auVar80._12_4_ >> 0x10) - fVar236) * fVar151;
  uVar54 = *(ulong *)(prim + lVar48 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar54;
  auVar176._12_2_ = uVar99;
  auVar176._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar54;
  auVar175._10_2_ = uVar99;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar99;
  auVar174._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar43._4_8_ = auVar174._8_8_;
  auVar43._2_2_ = uVar99;
  auVar43._0_2_ = uVar99;
  auVar177._0_8_ =
       CONCAT44(((float)(auVar43._0_4_ >> 0x10) - fVar171) * fVar116,
                ((float)(int)(short)uVar54 - fVar153) * fVar100);
  auVar177._8_4_ = ((float)(auVar174._8_4_ >> 0x10) - fVar172) * fVar132;
  auVar177._12_4_ = ((float)(auVar175._12_4_ >> 0x10) - fVar173) * fVar152;
  uVar54 = *(ulong *)(prim + uVar52 * 0x17 + 6);
  uVar99 = (undefined2)(uVar54 >> 0x30);
  auVar229._8_4_ = 0;
  auVar229._0_8_ = uVar54;
  auVar229._12_2_ = uVar99;
  auVar229._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar54 >> 0x20);
  auVar228._12_4_ = auVar229._12_4_;
  auVar228._8_2_ = 0;
  auVar228._0_8_ = uVar54;
  auVar228._10_2_ = uVar99;
  auVar227._10_6_ = auVar228._10_6_;
  auVar227._8_2_ = uVar99;
  auVar227._0_8_ = uVar54;
  uVar99 = (undefined2)(uVar54 >> 0x10);
  auVar44._4_8_ = auVar227._8_8_;
  auVar44._2_2_ = uVar99;
  auVar44._0_2_ = uVar99;
  auVar230._0_4_ = ((float)(int)(short)uVar54 - fVar153) * fVar100;
  auVar230._4_4_ = ((float)(auVar44._0_4_ >> 0x10) - fVar171) * fVar116;
  auVar230._8_4_ = ((float)(auVar227._8_4_ >> 0x10) - fVar172) * fVar132;
  auVar230._12_4_ = ((float)(auVar228._12_4_ >> 0x10) - fVar173) * fVar152;
  auVar237._8_4_ = auVar136._8_4_;
  auVar237._0_8_ = auVar136._0_8_;
  auVar237._12_4_ = auVar136._12_4_;
  auVar238 = minps(auVar237,auVar187);
  auVar103._8_4_ = auVar217._8_4_;
  auVar103._0_8_ = auVar217._0_8_;
  auVar103._12_4_ = auVar217._12_4_;
  auVar72 = minps(auVar103,auVar82);
  auVar238 = maxps(auVar238,auVar72);
  auVar104._8_4_ = auVar177._8_4_;
  auVar104._0_8_ = auVar177._0_8_;
  auVar104._12_4_ = auVar177._12_4_;
  auVar72 = minps(auVar104,auVar230);
  uVar51 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar155._4_4_ = uVar51;
  auVar155._0_4_ = uVar51;
  auVar155._8_4_ = uVar51;
  auVar155._12_4_ = uVar51;
  auVar72 = maxps(auVar72,auVar155);
  auVar72 = maxps(auVar238,auVar72);
  local_188 = auVar72._0_4_ * 0.99999964;
  fStack_184 = auVar72._4_4_ * 0.99999964;
  fStack_180 = auVar72._8_4_ * 0.99999964;
  fStack_17c = auVar72._12_4_ * 0.99999964;
  auVar72 = maxps(auVar136,auVar187);
  auVar238 = maxps(auVar217,auVar82);
  auVar72 = minps(auVar72,auVar238);
  auVar238 = maxps(auVar177,auVar230);
  fVar117 = (ray->super_RayK<1>).tfar;
  auVar83._4_4_ = fVar117;
  auVar83._0_4_ = fVar117;
  auVar83._8_4_ = fVar117;
  auVar83._12_4_ = fVar117;
  auVar238 = minps(auVar238,auVar83);
  auVar72 = minps(auVar72,auVar238);
  auVar105._0_4_ = -(uint)(PVar7 != (Primitive)0x0 && local_188 <= auVar72._0_4_ * 1.0000004);
  auVar105._4_4_ = -(uint)(1 < (byte)PVar7 && fStack_184 <= auVar72._4_4_ * 1.0000004);
  auVar105._8_4_ = -(uint)(2 < (byte)PVar7 && fStack_180 <= auVar72._8_4_ * 1.0000004);
  auVar105._12_4_ = -(uint)(3 < (byte)PVar7 && fStack_17c <= auVar72._12_4_ * 1.0000004);
  uVar57 = movmskps((int)lVar48,auVar105);
  if (uVar57 == 0) {
    return;
  }
  uVar57 = uVar57 & 0xff;
  local_158._0_12_ = mm_lookupmask_ps._240_12_;
  local_158._12_4_ = 0;
  local_2a0 = prim;
LAB_00b5508e:
  local_330 = (ulong)uVar57;
  lVar48 = 0;
  if (local_330 != 0) {
    for (; (uVar57 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
    }
  }
  local_330 = local_330 - 1 & local_330;
  local_560 = (RTCIntersectArguments *)(ulong)*(uint *)(local_2a0 + 2);
  local_4d0 = (ulong)*(uint *)(local_2a0 + lVar48 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[(long)local_560].ptr;
  pRVar53 = (RTCIntersectArguments *)
            pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 + (long)pRVar53 * local_4d0);
  p_Var9 = pGVar8[1].intersectionFilterN;
  lVar48 = 0;
  if (local_330 != 0) {
    for (; (local_330 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
    }
  }
  lVar48 = *(long *)&pGVar8[1].time_range.upper;
  pfVar2 = (float *)(lVar48 + (long)p_Var9 * uVar54);
  pfVar3 = (float *)(lVar48 + (uVar54 + 1) * (long)p_Var9);
  pfVar4 = (float *)(lVar48 + (uVar54 + 2) * (long)p_Var9);
  pfVar5 = (float *)(lVar48 + (uVar54 + 3) * (long)p_Var9);
  if ((local_330 != 0) && (uVar54 = local_330 - 1 & local_330, uVar54 != 0)) {
    lVar55 = 0;
    if (uVar54 != 0) {
      for (; (uVar54 >> lVar55 & 1) == 0; lVar55 = lVar55 + 1) {
      }
    }
    pRVar53 = (RTCIntersectArguments *)
              ((long)pRVar53 * (ulong)*(uint *)(local_2a0 + lVar55 * 4 + 6));
  }
  local_458 = (ray->super_RayK<1>).org.field_0.m128[0];
  fStack_454 = (ray->super_RayK<1>).org.field_0.m128[1];
  fStack_450 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_3a8 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_3b8 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_398 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar117 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_11c = local_3a8 * local_3a8;
  fVar100 = local_3b8 * local_3b8;
  fVar101 = local_398 * local_398;
  fVar117 = fVar117 * fVar117;
  fVar62 = fStack_11c + fVar100 + fVar101;
  auVar156._0_8_ = CONCAT44(fVar100 + fVar100 + fVar117,fVar62);
  auVar156._8_4_ = fVar101 + fVar100 + fVar101;
  auVar156._12_4_ = fVar117 + fVar100 + fVar117;
  auVar137._8_4_ = auVar156._8_4_;
  auVar137._0_8_ = auVar156._0_8_;
  auVar137._12_4_ = auVar156._12_4_;
  auVar72 = rcpss(auVar137,auVar156);
  local_368 = (2.0 - fVar62 * auVar72._0_4_) * auVar72._0_4_ *
              (((pfVar2[2] + pfVar3[2]) * 0.5 - fStack_450) * local_398 +
              ((pfVar2[1] + pfVar3[1]) * 0.5 - fStack_454) * local_3b8 +
              ((*pfVar2 + *pfVar3) * 0.5 - local_458) * local_3a8);
  local_2d8 = ZEXT416((uint)local_368);
  fStack_364 = local_368;
  fStack_360 = local_368;
  fStack_35c = local_368;
  local_458 = local_3a8 * local_368 + local_458;
  fStack_454 = local_3b8 * local_368 + fStack_454;
  fStack_450 = local_398 * local_368 + fStack_450;
  local_4b8 = *pfVar2 - local_458;
  fStack_4b4 = pfVar2[1] - fStack_454;
  fStack_4b0 = pfVar2[2] - fStack_450;
  fStack_4ac = pfVar2[3] - 0.0;
  local_448 = *pfVar4 - local_458;
  fStack_444 = pfVar4[1] - fStack_454;
  fStack_440 = pfVar4[2] - fStack_450;
  fStack_43c = pfVar4[3] - 0.0;
  local_438 = *pfVar3 - local_458;
  fStack_434 = pfVar3[1] - fStack_454;
  fStack_430 = pfVar3[2] - fStack_450;
  fStack_42c = pfVar3[3] - 0.0;
  local_458 = *pfVar5 - local_458;
  fStack_454 = pfVar5[1] - fStack_454;
  fStack_450 = pfVar5[2] - fStack_450;
  fStack_44c = pfVar5[3] - 0.0;
  local_1b8 = local_4b8;
  fStack_1b4 = local_4b8;
  fStack_1b0 = local_4b8;
  fStack_1ac = local_4b8;
  local_138 = fStack_4b4;
  fStack_134 = fStack_4b4;
  fStack_130 = fStack_4b4;
  fStack_12c = fStack_4b4;
  local_148 = fStack_4b0;
  fStack_144 = fStack_4b0;
  fStack_140 = fStack_4b0;
  fStack_13c = fStack_4b0;
  local_1c8 = fStack_4ac;
  fStack_1c4 = fStack_4ac;
  fStack_1c0 = fStack_4ac;
  fStack_1bc = fStack_4ac;
  local_1d8 = local_438;
  fStack_1d4 = local_438;
  fStack_1d0 = local_438;
  fStack_1cc = local_438;
  local_1e8 = fStack_434;
  fStack_1e4 = fStack_434;
  fStack_1e0 = fStack_434;
  fStack_1dc = fStack_434;
  local_1f8 = fStack_430;
  fStack_1f4 = fStack_430;
  fStack_1f0 = fStack_430;
  fStack_1ec = fStack_430;
  local_208 = fStack_42c;
  fStack_204 = fStack_42c;
  fStack_200 = fStack_42c;
  fStack_1fc = fStack_42c;
  local_218 = local_448;
  fStack_214 = local_448;
  fStack_210 = local_448;
  fStack_20c = local_448;
  local_228 = fStack_444;
  fStack_224 = fStack_444;
  fStack_220 = fStack_444;
  fStack_21c = fStack_444;
  local_238 = fStack_440;
  fStack_234 = fStack_440;
  fStack_230 = fStack_440;
  fStack_22c = fStack_440;
  local_128 = fStack_11c + fVar101 + fVar100;
  fStack_124 = fStack_11c + fVar101 + fVar100;
  fStack_120 = fStack_11c + fVar101 + fVar100;
  fStack_11c = fStack_11c + fVar101 + fVar100;
  local_248 = fStack_43c;
  fStack_244 = fStack_43c;
  fStack_240 = fStack_43c;
  fStack_23c = fStack_43c;
  local_258 = local_458;
  fStack_254 = local_458;
  fStack_250 = local_458;
  fStack_24c = local_458;
  local_268 = fStack_454;
  fStack_264 = fStack_454;
  fStack_260 = fStack_454;
  fStack_25c = fStack_454;
  local_278 = fStack_450;
  fStack_274 = fStack_450;
  fStack_270 = fStack_450;
  fStack_26c = fStack_450;
  local_288 = fStack_44c;
  fStack_284 = fStack_44c;
  fStack_280 = fStack_44c;
  fStack_27c = fStack_44c;
  fStack_3a4 = local_3a8;
  fStack_3a0 = local_3a8;
  fStack_39c = local_3a8;
  fStack_3b4 = local_3b8;
  fStack_3b0 = local_3b8;
  fStack_3ac = local_3b8;
  fStack_394 = local_398;
  fStack_390 = local_398;
  fStack_38c = local_398;
  local_298 = ABS(local_128);
  fStack_294 = ABS(fStack_124);
  fStack_290 = ABS(fStack_120);
  fStack_28c = ABS(fStack_11c);
  uVar54 = 1;
  local_470 = 1;
  local_3c8 = 0.0;
  fStack_3c4 = 1.0;
  uStack_3c0 = 0;
  uStack_3bc = 0;
  uVar47 = 0;
  do {
    local_518 = fStack_3c4 - local_3c8;
    local_528._4_4_ = local_3c8;
    local_528._0_4_ = local_3c8;
    fStack_520 = local_3c8;
    fStack_51c = local_3c8;
    fVar116 = local_518 * 0.0 + local_3c8;
    fVar118 = local_518 * 0.33333334 + local_3c8;
    fVar131 = local_518 * 0.6666667 + local_3c8;
    fVar132 = local_518 * 1.0 + local_3c8;
    fVar133 = 1.0 - fVar116;
    fVar199 = 1.0 - fVar118;
    fVar225 = 1.0 - fVar131;
    fVar241 = 1.0 - fVar132;
    fVar117 = fVar116 * 3.0;
    fVar62 = fVar118 * 3.0;
    fVar100 = fVar131 * 3.0;
    fVar101 = fVar132 * 3.0;
    fVar171 = ((fVar133 * 3.0 + -5.0) * fVar133 * fVar133 + 2.0) * 0.5;
    fVar172 = ((fVar199 * 3.0 + -5.0) * fVar199 * fVar199 + 2.0) * 0.5;
    fVar235 = ((fVar225 * 3.0 + -5.0) * fVar225 * fVar225 + 2.0) * 0.5;
    fVar236 = ((fVar241 * 3.0 + -5.0) * fVar241 * fVar241 + 2.0) * 0.5;
    fVar134 = -fVar133 * fVar116 * fVar116 * 0.5;
    fVar152 = -fVar199 * fVar118 * fVar118 * 0.5;
    fVar173 = -fVar225 * fVar131 * fVar131 * 0.5;
    fVar180 = -fVar241 * fVar132 * fVar132 * 0.5;
    fVar248 = (fVar116 * fVar116 * (fVar117 + -5.0) + 2.0) * 0.5;
    fVar249 = (fVar118 * fVar118 * (fVar62 + -5.0) + 2.0) * 0.5;
    fVar250 = (fVar131 * fVar131 * (fVar100 + -5.0) + 2.0) * 0.5;
    fVar251 = (fVar132 * fVar132 * (fVar101 + -5.0) + 2.0) * 0.5;
    fVar102 = local_518 * 0.11111111;
    fVar151 = -fVar116 * fVar133 * fVar133 * 0.5;
    fVar153 = -fVar118 * fVar199 * fVar199 * 0.5;
    fVar119 = -fVar131 * fVar225 * fVar225 * 0.5;
    fVar181 = -fVar132 * fVar241 * fVar241 * 0.5;
    local_5b8 = local_1b8 * fVar151 +
                local_1d8 * fVar248 + local_218 * fVar171 + local_258 * fVar134;
    fStack_5b4 = fStack_1b4 * fVar153 +
                 fStack_1d4 * fVar249 + fStack_214 * fVar172 + fStack_254 * fVar152;
    fStack_5b0 = fStack_1b0 * fVar119 +
                 fStack_1d0 * fVar250 + fStack_210 * fVar235 + fStack_250 * fVar173;
    fStack_5ac = fStack_1ac * fVar181 +
                 fStack_1cc * fVar251 + fStack_20c * fVar236 + fStack_24c * fVar180;
    fVar182 = local_138 * fVar151 + local_1e8 * fVar248 + local_228 * fVar171 + local_268 * fVar134;
    fVar200 = fStack_134 * fVar153 +
              fStack_1e4 * fVar249 + fStack_224 * fVar172 + fStack_264 * fVar152;
    fVar226 = fStack_130 * fVar119 +
              fStack_1e0 * fVar250 + fStack_220 * fVar235 + fStack_260 * fVar173;
    fVar242 = fStack_12c * fVar181 +
              fStack_1dc * fVar251 + fStack_21c * fVar236 + fStack_25c * fVar180;
    fVar198 = local_148 * fVar151 + local_1f8 * fVar248 + local_238 * fVar171 + local_278 * fVar134;
    fVar224 = fStack_144 * fVar153 +
              fStack_1f4 * fVar249 + fStack_234 * fVar172 + fStack_274 * fVar152;
    fVar234 = fStack_140 * fVar119 +
              fStack_1f0 * fVar250 + fStack_230 * fVar235 + fStack_270 * fVar173;
    fVar243 = fStack_13c * fVar181 +
              fStack_1ec * fVar251 + fStack_22c * fVar236 + fStack_26c * fVar180;
    fVar171 = fVar151 * local_1c8 + fVar248 * local_208 + fVar171 * local_248 + fVar134 * local_288;
    fVar172 = fVar153 * fStack_1c4 +
              fVar249 * fStack_204 + fVar172 * fStack_244 + fVar152 * fStack_284;
    auVar178._0_8_ = CONCAT44(fVar172,fVar171);
    auVar178._8_4_ =
         fVar119 * fStack_1c0 + fVar250 * fStack_200 + fVar235 * fStack_240 + fVar173 * fStack_280;
    auVar178._12_4_ =
         fVar181 * fStack_1bc + fVar251 * fStack_1fc + fVar236 * fStack_23c + fVar180 * fStack_27c;
    fVar173 = fVar116 * (fVar133 + fVar133);
    fVar180 = fVar118 * (fVar199 + fVar199);
    fVar235 = fVar131 * (fVar225 + fVar225);
    fVar248 = fVar132 * (fVar241 + fVar241);
    fVar119 = (fVar173 - fVar133 * fVar133) * 0.5;
    fVar181 = (fVar180 - fVar199 * fVar199) * 0.5;
    fVar236 = (fVar235 - fVar225 * fVar225) * 0.5;
    fVar249 = (fVar248 - fVar241 * fVar241) * 0.5;
    fVar134 = (fVar116 * fVar117 + (fVar116 + fVar116) * (fVar117 + -5.0)) * 0.5;
    fVar151 = (fVar118 * fVar62 + (fVar118 + fVar118) * (fVar62 + -5.0)) * 0.5;
    fVar152 = (fVar131 * fVar100 + (fVar131 + fVar131) * (fVar100 + -5.0)) * 0.5;
    fVar153 = (fVar132 * fVar101 + (fVar132 + fVar132) * (fVar101 + -5.0)) * 0.5;
    fVar117 = ((fVar117 + 2.0) * (fVar133 + fVar133) - fVar133 * 3.0 * fVar133) * 0.5;
    fVar62 = ((fVar62 + 2.0) * (fVar199 + fVar199) - fVar199 * 3.0 * fVar199) * 0.5;
    fVar100 = ((fVar100 + 2.0) * (fVar225 + fVar225) - fVar225 * 3.0 * fVar225) * 0.5;
    fVar101 = ((fVar101 + 2.0) * (fVar241 + fVar241) - fVar241 * 3.0 * fVar241) * 0.5;
    fVar116 = (fVar116 * fVar116 - fVar173) * 0.5;
    fVar118 = (fVar118 * fVar118 - fVar180) * 0.5;
    fVar131 = (fVar131 * fVar131 - fVar235) * 0.5;
    fVar132 = (fVar132 * fVar132 - fVar248) * 0.5;
    local_588 = (local_1b8 * fVar119 +
                local_1d8 * fVar134 + local_218 * fVar117 + local_258 * fVar116) * fVar102;
    fStack_584 = (fStack_1b4 * fVar181 +
                 fStack_1d4 * fVar151 + fStack_214 * fVar62 + fStack_254 * fVar118) * fVar102;
    fStack_580 = (fStack_1b0 * fVar236 +
                 fStack_1d0 * fVar152 + fStack_210 * fVar100 + fStack_250 * fVar131) * fVar102;
    fStack_57c = (fStack_1ac * fVar249 +
                 fStack_1cc * fVar153 + fStack_20c * fVar101 + fStack_24c * fVar132) * fVar102;
    local_4c8 = (local_138 * fVar119 +
                local_1e8 * fVar134 + local_228 * fVar117 + local_268 * fVar116) * fVar102;
    local_558._0_4_ =
         (fStack_134 * fVar181 + fStack_1e4 * fVar151 + fStack_224 * fVar62 + fStack_264 * fVar118)
         * fVar102;
    local_558._4_4_ =
         (fStack_130 * fVar236 + fStack_1e0 * fVar152 + fStack_220 * fVar100 + fStack_260 * fVar131)
         * fVar102;
    fStack_550 = (fStack_12c * fVar249 +
                 fStack_1dc * fVar153 + fStack_21c * fVar101 + fStack_25c * fVar132) * fVar102;
    local_578 = (local_148 * fVar119 +
                local_1f8 * fVar134 + local_238 * fVar117 + local_278 * fVar116) * fVar102;
    fStack_574 = (fStack_144 * fVar181 +
                 fStack_1f4 * fVar151 + fStack_234 * fVar62 + fStack_274 * fVar118) * fVar102;
    fStack_570 = (fStack_140 * fVar236 +
                 fStack_1f0 * fVar152 + fStack_230 * fVar100 + fStack_270 * fVar131) * fVar102;
    fStack_56c = (fStack_13c * fVar249 +
                 fStack_1ec * fVar153 + fStack_22c * fVar101 + fStack_26c * fVar132) * fVar102;
    fVar62 = fVar102 * (fVar181 * fStack_1c4 +
                       fVar151 * fStack_204 + fVar62 * fStack_244 + fVar118 * fStack_284);
    fVar100 = fVar102 * (fVar236 * fStack_1c0 +
                        fVar152 * fStack_200 + fVar100 * fStack_240 + fVar131 * fStack_280);
    fVar101 = fVar102 * (fVar249 * fStack_1bc +
                        fVar153 * fStack_1fc + fVar101 * fStack_23c + fVar132 * fStack_27c);
    auVar14._4_4_ = fVar200;
    auVar14._0_4_ = fVar182;
    auVar14._8_4_ = fVar226;
    auVar14._12_4_ = fVar242;
    local_538._0_12_ = auVar14._4_12_;
    local_538._12_4_ = 0;
    auVar15._4_4_ = fVar224;
    auVar15._0_4_ = fVar198;
    auVar15._8_4_ = fVar234;
    auVar15._12_4_ = fVar243;
    _local_5c8 = auVar15._4_12_;
    fStack_5bc = 0.0;
    auVar138._4_4_ = auVar178._8_4_;
    auVar138._0_4_ = fVar172;
    auVar138._8_4_ = auVar178._12_4_;
    auVar138._12_4_ = 0;
    auVar188._0_4_ =
         fVar171 + fVar102 * (fVar119 * local_1c8 +
                             fVar134 * local_208 + fVar117 * local_248 + fVar116 * local_288);
    auVar188._4_4_ = fVar172 + fVar62;
    auVar188._8_4_ = auVar178._8_4_ + fVar100;
    auVar188._12_4_ = auVar178._12_4_ + fVar101;
    auVar231._0_8_ = CONCAT44(auVar178._8_4_ - fVar100,fVar172 - fVar62);
    auVar231._8_4_ = auVar178._12_4_ - fVar101;
    auVar231._12_4_ = 0;
    local_358._0_4_ = fVar200 - fVar182;
    local_358._4_4_ = fVar226 - fVar200;
    local_358._8_4_ = fVar242 - fVar226;
    local_358._12_4_ = 0.0 - fVar242;
    local_388 = fVar224 - fVar198;
    fStack_384 = fVar234 - fVar224;
    fStack_380 = fVar243 - fVar234;
    fStack_37c = 0.0 - fVar243;
    fVar117 = local_4c8 * local_388 - local_578 * (float)local_358._0_4_;
    fVar62 = (float)local_558._0_4_ * fStack_384 - fStack_574 * (float)local_358._4_4_;
    fVar100 = (float)local_558._4_4_ * fStack_380 - fStack_570 * (float)local_358._8_4_;
    fVar101 = fStack_550 * fStack_37c - fStack_56c * (float)local_358._12_4_;
    local_3d8._0_4_ = fStack_5b4 - local_5b8;
    local_3d8._4_4_ = fStack_5b0 - fStack_5b4;
    fStack_3d0 = fStack_5ac - fStack_5b0;
    fStack_3cc = 0.0 - fStack_5ac;
    fVar132 = local_578 * (float)local_3d8._0_4_ - local_588 * local_388;
    fVar134 = fStack_574 * (float)local_3d8._4_4_ - fStack_584 * fStack_384;
    fVar151 = fStack_570 * fStack_3d0 - fStack_580 * fStack_380;
    fVar152 = fStack_56c * fStack_3cc - fStack_57c * fStack_37c;
    fVar153 = local_588 * (float)local_358._0_4_ - local_4c8 * (float)local_3d8._0_4_;
    fVar171 = fStack_584 * (float)local_358._4_4_ - (float)local_558._0_4_ * (float)local_3d8._4_4_;
    fVar172 = fStack_580 * (float)local_358._8_4_ - (float)local_558._4_4_ * fStack_3d0;
    fVar173 = fStack_57c * (float)local_358._12_4_ - fStack_550 * fStack_3cc;
    auVar218._0_4_ = (float)local_358._0_4_ * (float)local_358._0_4_ + local_388 * local_388;
    auVar218._4_4_ = (float)local_358._4_4_ * (float)local_358._4_4_ + fStack_384 * fStack_384;
    auVar218._8_4_ = (float)local_358._8_4_ * (float)local_358._8_4_ + fStack_380 * fStack_380;
    auVar218._12_4_ = (float)local_358._12_4_ * (float)local_358._12_4_ + fStack_37c * fStack_37c;
    auVar239._0_4_ = (float)local_3d8._0_4_ * (float)local_3d8._0_4_ + auVar218._0_4_;
    auVar239._4_4_ = (float)local_3d8._4_4_ * (float)local_3d8._4_4_ + auVar218._4_4_;
    auVar239._8_4_ = fStack_3d0 * fStack_3d0 + auVar218._8_4_;
    auVar239._12_4_ = fStack_3cc * fStack_3cc + auVar218._12_4_;
    auVar72 = rcpps(auVar218,auVar239);
    fVar102 = auVar72._0_4_;
    fVar116 = auVar72._4_4_;
    fVar118 = auVar72._8_4_;
    fVar131 = auVar72._12_4_;
    fVar102 = (1.0 - fVar102 * auVar239._0_4_) * fVar102 + fVar102;
    fVar116 = (1.0 - fVar116 * auVar239._4_4_) * fVar116 + fVar116;
    fVar118 = (1.0 - fVar118 * auVar239._8_4_) * fVar118 + fVar118;
    fVar131 = (1.0 - fVar131 * auVar239._12_4_) * fVar131 + fVar131;
    fVar119 = local_388 * (float)local_558._0_4_ - (float)local_358._0_4_ * fStack_574;
    fVar180 = fStack_384 * (float)local_558._4_4_ - (float)local_358._4_4_ * fStack_570;
    fVar181 = fStack_380 * fStack_550 - (float)local_358._8_4_ * fStack_56c;
    fVar133 = fStack_37c * 0.0 - (float)local_358._12_4_ * 0.0;
    local_598._4_4_ = fStack_570;
    local_598._0_4_ = fStack_574;
    fStack_590 = fStack_56c;
    fStack_58c = 0.0;
    fVar199 = (float)local_3d8._0_4_ * fStack_574 - local_388 * fStack_584;
    fVar225 = (float)local_3d8._4_4_ * fStack_570 - fStack_384 * fStack_580;
    fVar235 = fStack_3d0 * fStack_56c - fStack_380 * fStack_57c;
    fVar236 = fStack_3cc * 0.0 - fStack_37c * 0.0;
    uStack_54c = 0;
    fStack_4ec = 0.0;
    fVar241 = (float)local_358._0_4_ * fStack_584 - (float)local_3d8._0_4_ * (float)local_558._0_4_;
    fVar248 = (float)local_358._4_4_ * fStack_580 - (float)local_3d8._4_4_ * (float)local_558._4_4_;
    fVar249 = (float)local_358._8_4_ * fStack_57c - fStack_3d0 * fStack_550;
    fVar250 = (float)local_358._12_4_ * 0.0 - fStack_3cc * 0.0;
    auVar106._0_4_ = (fVar117 * fVar117 + fVar132 * fVar132 + fVar153 * fVar153) * fVar102;
    auVar106._4_4_ = (fVar62 * fVar62 + fVar134 * fVar134 + fVar171 * fVar171) * fVar116;
    auVar106._8_4_ = (fVar100 * fVar100 + fVar151 * fVar151 + fVar172 * fVar172) * fVar118;
    auVar106._12_4_ = (fVar101 * fVar101 + fVar152 * fVar152 + fVar173 * fVar173) * fVar131;
    auVar244._0_4_ = (fVar119 * fVar119 + fVar199 * fVar199 + fVar241 * fVar241) * fVar102;
    auVar244._4_4_ = (fVar180 * fVar180 + fVar225 * fVar225 + fVar248 * fVar248) * fVar116;
    auVar244._8_4_ = (fVar181 * fVar181 + fVar235 * fVar235 + fVar249 * fVar249) * fVar118;
    auVar244._12_4_ = (fVar133 * fVar133 + fVar236 * fVar236 + fVar250 * fVar250) * fVar131;
    auVar72 = maxps(auVar106,auVar244);
    auVar219._8_4_ = auVar178._8_4_;
    auVar219._0_8_ = auVar178._0_8_;
    auVar219._12_4_ = auVar178._12_4_;
    auVar220 = maxps(auVar219,auVar188);
    auVar157._8_4_ = auVar231._8_4_;
    auVar157._0_8_ = auVar231._0_8_;
    auVar157._12_4_ = 0;
    auVar238 = maxps(auVar157,auVar138);
    auVar221 = maxps(auVar220,auVar238);
    auVar238 = minps(auVar178,auVar188);
    auVar220 = minps(auVar231,auVar138);
    auVar220 = minps(auVar238,auVar220);
    auVar72 = sqrtps(auVar72,auVar72);
    auVar238 = rsqrtps(auVar72,auVar239);
    fVar117 = auVar238._0_4_;
    fVar62 = auVar238._4_4_;
    fVar100 = auVar238._8_4_;
    fVar101 = auVar238._12_4_;
    local_178 = fVar117 * 1.5 - fVar117 * fVar117 * auVar239._0_4_ * 0.5 * fVar117;
    fStack_174 = fVar62 * 1.5 - fVar62 * fVar62 * auVar239._4_4_ * 0.5 * fVar62;
    fStack_170 = fVar100 * 1.5 - fVar100 * fVar100 * auVar239._8_4_ * 0.5 * fVar100;
    fStack_16c = fVar101 * 1.5 - fVar101 * fVar101 * auVar239._12_4_ * 0.5 * fVar101;
    local_5a8._0_4_ = 0.0 - fVar182;
    local_5a8._4_4_ = 0.0 - fVar200;
    fStack_5a0 = 0.0 - fVar226;
    fStack_59c = 0.0 - fVar242;
    local_348 = 0.0 - fVar198;
    fStack_344 = 0.0 - fVar224;
    fStack_340 = 0.0 - fVar234;
    fStack_33c = 0.0 - fVar243;
    fVar102 = 0.0 - local_5b8;
    fVar116 = 0.0 - fStack_5b4;
    fVar118 = 0.0 - fStack_5b0;
    fVar131 = 0.0 - fStack_5ac;
    local_3e8._0_4_ =
         local_3a8 * (float)local_3d8._0_4_ * local_178 +
         local_3b8 * (float)local_358._0_4_ * local_178 + local_398 * local_388 * local_178;
    local_3e8._4_4_ =
         fStack_3a4 * (float)local_3d8._4_4_ * fStack_174 +
         fStack_3b4 * (float)local_358._4_4_ * fStack_174 + fStack_394 * fStack_384 * fStack_174;
    fStack_3e0 = fStack_3a0 * fStack_3d0 * fStack_170 +
                 fStack_3b0 * (float)local_358._8_4_ * fStack_170 +
                 fStack_390 * fStack_380 * fStack_170;
    fStack_3dc = fStack_39c * fStack_3cc * fStack_16c +
                 fStack_3ac * (float)local_358._12_4_ * fStack_16c +
                 fStack_38c * fStack_37c * fStack_16c;
    local_2e8._0_4_ =
         (float)local_3d8._0_4_ * local_178 * fVar102 +
         (float)local_358._0_4_ * local_178 * (float)local_5a8._0_4_ +
         local_388 * local_178 * local_348;
    local_2e8._4_4_ =
         (float)local_3d8._4_4_ * fStack_174 * fVar116 +
         (float)local_358._4_4_ * fStack_174 * (float)local_5a8._4_4_ +
         fStack_384 * fStack_174 * fStack_344;
    local_2e8._8_4_ =
         fStack_3d0 * fStack_170 * fVar118 +
         (float)local_358._8_4_ * fStack_170 * fStack_5a0 + fStack_380 * fStack_170 * fStack_340;
    local_2e8._12_4_ =
         fStack_3cc * fStack_16c * fVar131 +
         (float)local_358._12_4_ * fStack_16c * fStack_59c + fStack_37c * fStack_16c * fStack_33c;
    fVar132 = (local_3a8 * fVar102 + local_3b8 * (float)local_5a8._0_4_ + local_398 * local_348) -
              (float)local_3e8._0_4_ * (float)local_2e8._0_4_;
    fVar134 = (fStack_3a4 * fVar116 + fStack_3b4 * (float)local_5a8._4_4_ + fStack_394 * fStack_344)
              - (float)local_3e8._4_4_ * (float)local_2e8._4_4_;
    fVar151 = (fStack_3a0 * fVar118 + fStack_3b0 * fStack_5a0 + fStack_390 * fStack_340) -
              fStack_3e0 * (float)local_2e8._8_4_;
    fVar152 = (fStack_39c * fVar131 + fStack_3ac * fStack_59c + fStack_38c * fStack_33c) -
              fStack_3dc * (float)local_2e8._12_4_;
    fVar153 = (fVar102 * fVar102 +
              (float)local_5a8._0_4_ * (float)local_5a8._0_4_ + local_348 * local_348) -
              (float)local_2e8._0_4_ * (float)local_2e8._0_4_;
    fVar171 = (fVar116 * fVar116 +
              (float)local_5a8._4_4_ * (float)local_5a8._4_4_ + fStack_344 * fStack_344) -
              (float)local_2e8._4_4_ * (float)local_2e8._4_4_;
    fVar172 = (fVar118 * fVar118 + fStack_5a0 * fStack_5a0 + fStack_340 * fStack_340) -
              (float)local_2e8._8_4_ * (float)local_2e8._8_4_;
    fVar173 = (fVar131 * fVar131 + fStack_59c * fStack_59c + fStack_33c * fStack_33c) -
              (float)local_2e8._12_4_ * (float)local_2e8._12_4_;
    fVar117 = (auVar221._0_4_ + auVar72._0_4_) * 1.0000002;
    fVar62 = (auVar221._4_4_ + auVar72._4_4_) * 1.0000002;
    fVar100 = (auVar221._8_4_ + auVar72._8_4_) * 1.0000002;
    fVar101 = (auVar221._12_4_ + auVar72._12_4_) * 1.0000002;
    fVar117 = fVar153 - fVar117 * fVar117;
    fVar62 = fVar171 - fVar62 * fVar62;
    fVar100 = fVar172 - fVar100 * fVar100;
    fVar101 = fVar173 - fVar101 * fVar101;
    local_318._0_4_ = (float)local_3e8._0_4_ * (float)local_3e8._0_4_;
    local_318._4_4_ = (float)local_3e8._4_4_ * (float)local_3e8._4_4_;
    fStack_310 = fStack_3e0 * fStack_3e0;
    fStack_30c = fStack_3dc * fStack_3dc;
    local_328 = local_128 - (float)local_318._0_4_;
    fStack_324 = fStack_124 - (float)local_318._4_4_;
    fStack_320 = fStack_120 - fStack_310;
    fStack_31c = fStack_11c - fStack_30c;
    fVar132 = fVar132 + fVar132;
    fVar134 = fVar134 + fVar134;
    fVar151 = fVar151 + fVar151;
    fVar152 = fVar152 + fVar152;
    local_508._0_4_ = fVar132 * fVar132;
    local_508._4_4_ = fVar134 * fVar134;
    fStack_500 = fVar151 * fVar151;
    fStack_4fc = fVar152 * fVar152;
    local_168 = local_328 * 4.0;
    fStack_164 = fStack_324 * 4.0;
    fStack_160 = fStack_320 * 4.0;
    fStack_15c = fStack_31c * 4.0;
    auVar222._0_4_ = (float)local_508._0_4_ - local_168 * fVar117;
    auVar222._4_4_ = (float)local_508._4_4_ - fStack_164 * fVar62;
    auVar222._8_4_ = fStack_500 - fStack_160 * fVar100;
    auVar222._12_4_ = fStack_4fc - fStack_15c * fVar101;
    auVar139._4_4_ = -(uint)(0.0 <= auVar222._4_4_);
    auVar139._0_4_ = -(uint)(0.0 <= auVar222._0_4_);
    auVar139._8_4_ = -(uint)(0.0 <= auVar222._8_4_);
    auVar139._12_4_ = -(uint)(0.0 <= auVar222._12_4_);
    uVar51 = 0;
    iVar45 = movmskps((int)uVar54,auVar139);
    if (iVar45 == 0) {
      iVar45 = 0;
      auVar159 = _DAT_01feb9f0;
      auVar245 = _DAT_01feba00;
    }
    else {
      auVar221 = sqrtps(local_358,auVar222);
      bVar10 = 0.0 <= auVar222._0_4_;
      uVar57 = -(uint)bVar10;
      bVar56 = 0.0 <= auVar222._4_4_;
      uVar58 = -(uint)bVar56;
      bVar11 = 0.0 <= auVar222._8_4_;
      uVar59 = -(uint)bVar11;
      bVar12 = 0.0 <= auVar222._12_4_;
      uVar60 = -(uint)bVar12;
      auVar158._0_4_ = local_328 + local_328;
      auVar158._4_4_ = fStack_324 + fStack_324;
      auVar158._8_4_ = fStack_320 + fStack_320;
      auVar158._12_4_ = fStack_31c + fStack_31c;
      auVar238 = rcpps(local_2e8,auVar158);
      fVar119 = auVar238._0_4_;
      fVar181 = auVar238._4_4_;
      fVar199 = auVar238._8_4_;
      fVar235 = auVar238._12_4_;
      fVar119 = (1.0 - auVar158._0_4_ * fVar119) * fVar119 + fVar119;
      fVar181 = (1.0 - auVar158._4_4_ * fVar181) * fVar181 + fVar181;
      fVar199 = (1.0 - auVar158._8_4_ * fVar199) * fVar199 + fVar199;
      fVar235 = (1.0 - auVar158._12_4_ * fVar235) * fVar235 + fVar235;
      fVar180 = (-fVar132 - auVar221._0_4_) * fVar119;
      fVar133 = (-fVar134 - auVar221._4_4_) * fVar181;
      fVar225 = (-fVar151 - auVar221._8_4_) * fVar199;
      fVar236 = (-fVar152 - auVar221._12_4_) * fVar235;
      fVar119 = (auVar221._0_4_ - fVar132) * fVar119;
      fVar181 = (auVar221._4_4_ - fVar134) * fVar181;
      fVar199 = (auVar221._8_4_ - fVar151) * fVar199;
      fVar235 = (auVar221._12_4_ - fVar152) * fVar235;
      local_2b8[0] = ((float)local_3e8._0_4_ * fVar180 + (float)local_2e8._0_4_) * local_178;
      local_2b8[1] = ((float)local_3e8._4_4_ * fVar133 + (float)local_2e8._4_4_) * fStack_174;
      local_2b8[2] = (fStack_3e0 * fVar225 + (float)local_2e8._8_4_) * fStack_170;
      local_2b8[3] = (fStack_3dc * fVar236 + (float)local_2e8._12_4_) * fStack_16c;
      local_2c8._4_4_ = ((float)local_3e8._4_4_ * fVar181 + (float)local_2e8._4_4_) * fStack_174;
      local_2c8._0_4_ = ((float)local_3e8._0_4_ * fVar119 + (float)local_2e8._0_4_) * local_178;
      fStack_2c0 = (fStack_3e0 * fVar199 + (float)local_2e8._8_4_) * fStack_170;
      fStack_2bc = (fStack_3dc * fVar235 + (float)local_2e8._12_4_) * fStack_16c;
      auVar232._0_4_ = (uint)fVar180 & uVar57;
      auVar232._4_4_ = (uint)fVar133 & uVar58;
      auVar232._8_4_ = (uint)fVar225 & uVar59;
      auVar232._12_4_ = (uint)fVar236 & uVar60;
      auVar159._0_8_ = CONCAT44(~uVar58,~uVar57) & 0x7f8000007f800000;
      auVar159._8_4_ = ~uVar59 & 0x7f800000;
      auVar159._12_4_ = ~uVar60 & 0x7f800000;
      auVar159 = auVar159 | auVar232;
      auVar266._0_4_ = (uint)fVar119 & uVar57;
      auVar266._4_4_ = (uint)fVar181 & uVar58;
      auVar266._8_4_ = (uint)fVar199 & uVar59;
      auVar266._12_4_ = (uint)fVar235 & uVar60;
      auVar245._0_8_ = CONCAT44(~uVar58,~uVar57) & 0xff800000ff800000;
      auVar245._8_4_ = ~uVar59 & 0xff800000;
      auVar245._12_4_ = ~uVar60 & 0xff800000;
      auVar245 = auVar245 | auVar266;
      auVar189._0_8_ = CONCAT44(local_318._4_4_,local_318._0_4_) & 0x7fffffff7fffffff;
      auVar189._8_4_ = ABS(fStack_310);
      auVar189._12_4_ = ABS(fStack_30c);
      auVar27._4_4_ = fStack_294;
      auVar27._0_4_ = local_298;
      auVar27._8_4_ = fStack_290;
      auVar27._12_4_ = fStack_28c;
      auVar238 = maxps(auVar27,auVar189);
      fVar119 = auVar238._0_4_ * 1.9073486e-06;
      fVar180 = auVar238._4_4_ * 1.9073486e-06;
      fVar181 = auVar238._8_4_ * 1.9073486e-06;
      fVar133 = auVar238._12_4_ * 1.9073486e-06;
      auVar267._0_4_ = -(uint)(ABS(local_328) < fVar119 && bVar10);
      auVar267._4_4_ = -(uint)(ABS(fStack_324) < fVar180 && bVar56);
      auVar267._8_4_ = -(uint)(ABS(fStack_320) < fVar181 && bVar11);
      auVar267._12_4_ = -(uint)(ABS(fStack_31c) < fVar133 && bVar12);
      iVar45 = movmskps(iVar45,auVar267);
      if (iVar45 != 0) {
        uVar57 = -(uint)(fVar117 <= 0.0);
        uVar58 = -(uint)(fVar62 <= 0.0);
        uVar59 = -(uint)(fVar100 <= 0.0);
        uVar60 = -(uint)(fVar101 <= 0.0);
        auVar256._0_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar267._0_4_;
        auVar256._4_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar267._4_4_;
        auVar256._8_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar267._8_4_;
        auVar256._12_4_ = (uVar60 & 0xff800000 | ~uVar60 & 0x7f800000) & auVar267._12_4_;
        auVar190._0_4_ = ~auVar267._0_4_ & auVar159._0_4_;
        auVar190._4_4_ = ~auVar267._4_4_ & auVar159._4_4_;
        auVar190._8_4_ = ~auVar267._8_4_ & auVar159._8_4_;
        auVar190._12_4_ = ~auVar267._12_4_ & auVar159._12_4_;
        auVar160._0_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar267._0_4_;
        auVar160._4_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar267._4_4_;
        auVar160._8_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar267._8_4_;
        auVar160._12_4_ = (uVar60 & 0x7f800000 | ~uVar60 & 0xff800000) & auVar267._12_4_;
        auVar268._0_4_ = ~auVar267._0_4_ & auVar245._0_4_;
        auVar268._4_4_ = ~auVar267._4_4_ & auVar245._4_4_;
        auVar268._8_4_ = ~auVar267._8_4_ & auVar245._8_4_;
        auVar268._12_4_ = ~auVar267._12_4_ & auVar245._12_4_;
        auVar139._4_4_ = -(uint)((fVar180 <= ABS(fStack_324) || fVar62 <= 0.0) && bVar56);
        auVar139._0_4_ = -(uint)((fVar119 <= ABS(local_328) || fVar117 <= 0.0) && bVar10);
        auVar139._8_4_ = -(uint)((fVar181 <= ABS(fStack_320) || fVar100 <= 0.0) && bVar11);
        auVar139._12_4_ = -(uint)((fVar133 <= ABS(fStack_31c) || fVar101 <= 0.0) && bVar12);
        auVar159 = auVar190 | auVar256;
        auVar245 = auVar268 | auVar160;
      }
    }
    auVar140._0_4_ = (auVar139._0_4_ << 0x1f) >> 0x1f;
    auVar140._4_4_ = (auVar139._4_4_ << 0x1f) >> 0x1f;
    auVar140._8_4_ = (auVar139._8_4_ << 0x1f) >> 0x1f;
    auVar140._12_4_ = (auVar139._12_4_ << 0x1f) >> 0x1f;
    auVar140 = auVar140 & local_158;
    iVar45 = movmskps(iVar45,auVar140);
    uVar54 = uVar47;
    if (iVar45 != 0) {
      local_3f8._4_4_ = (auVar220._4_4_ - auVar72._4_4_) * 0.99999976;
      local_3f8._0_4_ = (auVar220._0_4_ - auVar72._0_4_) * 0.99999976;
      fStack_3f0 = (auVar220._8_4_ - auVar72._8_4_) * 0.99999976;
      fStack_3ec = (auVar220._12_4_ - auVar72._12_4_) * 0.99999976;
      auVar223._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2d8._0_4_;
      auVar223._4_4_ = auVar223._0_4_;
      auVar223._8_4_ = auVar223._0_4_;
      auVar223._12_4_ = auVar223._0_4_;
      auVar220 = maxps(auVar223,auVar159);
      auVar179._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2d8._0_4_;
      auVar179._4_4_ = auVar179._0_4_;
      auVar179._8_4_ = auVar179._0_4_;
      auVar179._12_4_ = auVar179._0_4_;
      auVar238 = minps(auVar179,auVar245);
      auVar84._0_4_ = local_4c8 * local_3b8 + local_578 * local_398;
      auVar84._4_4_ = (float)local_558._0_4_ * fStack_3b4 + fStack_574 * fStack_394;
      auVar84._8_4_ = (float)local_558._4_4_ * fStack_3b0 + fStack_570 * fStack_390;
      auVar84._12_4_ = fStack_550 * fStack_3ac + fStack_56c * fStack_38c;
      auVar261._0_4_ = local_588 * local_3a8 + auVar84._0_4_;
      auVar261._4_4_ = fStack_584 * fStack_3a4 + auVar84._4_4_;
      auVar261._8_4_ = fStack_580 * fStack_3a0 + auVar84._8_4_;
      auVar261._12_4_ = fStack_57c * fStack_39c + auVar84._12_4_;
      auVar72 = rcpps(auVar84,auVar261);
      fVar117 = auVar72._0_4_;
      fVar62 = auVar72._4_4_;
      fVar100 = auVar72._8_4_;
      fVar101 = auVar72._12_4_;
      fVar180 = (float)DAT_01feca10;
      fVar181 = DAT_01feca10._4_4_;
      fVar133 = DAT_01feca10._12_4_;
      fVar119 = DAT_01feca10._8_4_;
      fVar117 = ((fVar180 - auVar261._0_4_ * fVar117) * fVar117 + fVar117) *
                -(fVar102 * local_588 + (float)local_5a8._0_4_ * local_4c8 + local_348 * local_578);
      fVar62 = ((fVar181 - auVar261._4_4_ * fVar62) * fVar62 + fVar62) *
               -(fVar116 * fStack_584 +
                (float)local_5a8._4_4_ * (float)local_558._0_4_ + fStack_344 * fStack_574);
      fVar100 = ((fVar119 - auVar261._8_4_ * fVar100) * fVar100 + fVar100) *
                -(fVar118 * fStack_580 +
                 fStack_5a0 * (float)local_558._4_4_ + fStack_340 * fStack_570);
      fVar101 = ((fVar133 - auVar261._12_4_ * fVar101) * fVar101 + fVar101) *
                -(fVar131 * fStack_57c + fStack_59c * fStack_550 + fStack_33c * fStack_56c);
      uVar57 = -(uint)(auVar261._0_4_ < 0.0 || ABS(auVar261._0_4_) < 1e-18);
      uVar58 = -(uint)(auVar261._4_4_ < 0.0 || ABS(auVar261._4_4_) < 1e-18);
      uVar59 = -(uint)(auVar261._8_4_ < 0.0 || ABS(auVar261._8_4_) < 1e-18);
      uVar60 = -(uint)(auVar261._12_4_ < 0.0 || ABS(auVar261._12_4_) < 1e-18);
      auVar161._0_8_ = CONCAT44(uVar58,uVar57) & 0xff800000ff800000;
      auVar161._8_4_ = uVar59 & 0xff800000;
      auVar161._12_4_ = uVar60 & 0xff800000;
      auVar85._0_4_ = ~uVar57 & (uint)fVar117;
      auVar85._4_4_ = ~uVar58 & (uint)fVar62;
      auVar85._8_4_ = ~uVar59 & (uint)fVar100;
      auVar85._12_4_ = ~uVar60 & (uint)fVar101;
      auVar220 = maxps(auVar220,auVar85 | auVar161);
      uVar57 = -(uint)(0.0 < auVar261._0_4_ || ABS(auVar261._0_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar261._4_4_ || ABS(auVar261._4_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar261._8_4_ || ABS(auVar261._8_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar261._12_4_ || ABS(auVar261._12_4_) < 1e-18);
      auVar86._0_8_ = CONCAT44(uVar58,uVar57) & 0x7f8000007f800000;
      auVar86._8_4_ = uVar59 & 0x7f800000;
      auVar86._12_4_ = uVar60 & 0x7f800000;
      auVar262._0_4_ = ~uVar57 & (uint)fVar117;
      auVar262._4_4_ = ~uVar58 & (uint)fVar62;
      auVar262._8_4_ = ~uVar59 & (uint)fVar100;
      auVar262._12_4_ = ~uVar60 & (uint)fVar101;
      auVar238 = minps(auVar238,auVar262 | auVar86);
      auVar107._0_4_ = (0.0 - fVar200) * -(float)local_558._0_4_ + (0.0 - fVar224) * -fStack_574;
      auVar107._4_4_ = (0.0 - fVar226) * -(float)local_558._4_4_ + (0.0 - fVar234) * -fStack_570;
      auVar107._8_4_ = (0.0 - fVar242) * -fStack_550 + (0.0 - fVar243) * -fStack_56c;
      auVar107._12_4_ = 0x80000000;
      auVar269._0_4_ =
           -fStack_584 * local_3a8 + -(float)local_558._0_4_ * local_3b8 + -fStack_574 * local_398;
      auVar269._4_4_ =
           -fStack_580 * fStack_3a4 +
           -(float)local_558._4_4_ * fStack_3b4 + -fStack_570 * fStack_394;
      auVar269._8_4_ =
           -fStack_57c * fStack_3a0 + -fStack_550 * fStack_3b0 + -fStack_56c * fStack_390;
      auVar269._12_4_ = fStack_39c * -0.0 + fStack_3ac * -0.0 + fStack_38c * -0.0;
      auVar72 = rcpps(auVar107,auVar269);
      fVar117 = auVar72._0_4_;
      fVar62 = auVar72._4_4_;
      fVar100 = auVar72._8_4_;
      fVar101 = auVar72._12_4_;
      fVar117 = ((fVar180 - auVar269._0_4_ * fVar117) * fVar117 + fVar117) *
                -((0.0 - fStack_5b4) * -fStack_584 + auVar107._0_4_);
      fVar62 = ((fVar181 - auVar269._4_4_ * fVar62) * fVar62 + fVar62) *
               -((0.0 - fStack_5b0) * -fStack_580 + auVar107._4_4_);
      fVar100 = ((fVar119 - auVar269._8_4_ * fVar100) * fVar100 + fVar100) *
                -((0.0 - fStack_5ac) * -fStack_57c + auVar107._8_4_);
      fVar101 = ((fVar133 - auVar269._12_4_ * fVar101) * fVar101 + fVar101) * 0.0;
      uVar57 = -(uint)(auVar269._0_4_ < 0.0 || ABS(auVar269._0_4_) < 1e-18);
      uVar58 = -(uint)(auVar269._4_4_ < 0.0 || ABS(auVar269._4_4_) < 1e-18);
      uVar59 = -(uint)(auVar269._8_4_ < 0.0 || ABS(auVar269._8_4_) < 1e-18);
      uVar60 = -(uint)(auVar269._12_4_ < 0.0 || ABS(auVar269._12_4_) < 1e-18);
      auVar108._0_8_ = CONCAT44(uVar58,uVar57) & 0xff800000ff800000;
      auVar108._8_4_ = uVar59 & 0xff800000;
      auVar108._12_4_ = uVar60 & 0xff800000;
      auVar87._0_4_ = ~uVar57 & (uint)fVar117;
      auVar87._4_4_ = ~uVar58 & (uint)fVar62;
      auVar87._8_4_ = ~uVar59 & (uint)fVar100;
      auVar87._12_4_ = ~uVar60 & (uint)fVar101;
      local_378 = maxps(auVar220,auVar87 | auVar108);
      uVar57 = -(uint)(0.0 < auVar269._0_4_ || ABS(auVar269._0_4_) < 1e-18);
      uVar58 = -(uint)(0.0 < auVar269._4_4_ || ABS(auVar269._4_4_) < 1e-18);
      uVar59 = -(uint)(0.0 < auVar269._8_4_ || ABS(auVar269._8_4_) < 1e-18);
      uVar60 = -(uint)(0.0 < auVar269._12_4_ || ABS(auVar269._12_4_) < 1e-18);
      auVar88._0_8_ = CONCAT44(uVar58,uVar57) & 0x7f8000007f800000;
      auVar88._8_4_ = uVar59 & 0x7f800000;
      auVar88._12_4_ = uVar60 & 0x7f800000;
      auVar270._0_4_ = ~uVar57 & (uint)fVar117;
      auVar270._4_4_ = ~uVar58 & (uint)fVar62;
      auVar270._8_4_ = ~uVar59 & (uint)fVar100;
      auVar270._12_4_ = ~uVar60 & (uint)fVar101;
      local_198 = minps(auVar238,auVar270 | auVar88);
      fVar117 = local_378._12_4_;
      fVar62 = local_378._0_4_;
      fVar100 = local_378._4_4_;
      fVar101 = local_378._8_4_;
      auVar263._0_4_ = -(uint)(fVar62 <= local_198._0_4_) & auVar140._0_4_;
      auVar263._4_4_ = -(uint)(fVar100 <= local_198._4_4_) & auVar140._4_4_;
      auVar263._8_4_ = -(uint)(fVar101 <= local_198._8_4_) & auVar140._8_4_;
      auVar263._12_4_ = -(uint)(fVar117 <= local_198._12_4_) & auVar140._12_4_;
      iVar45 = movmskps(iVar45,auVar263);
      if (iVar45 != 0) {
        auVar72 = maxps(ZEXT816(0),_local_3f8);
        auVar26._4_4_ = local_2b8[1];
        auVar26._0_4_ = local_2b8[0];
        auVar26._8_4_ = local_2b8[2];
        auVar26._12_4_ = local_2b8[3];
        auVar238 = minps(auVar26,_DAT_01feca10);
        auVar191._0_12_ = ZEXT812(0);
        auVar191._12_4_ = 0;
        auVar238 = maxps(auVar238,auVar191);
        auVar220 = minps(_local_2c8,_DAT_01feca10);
        auVar220 = maxps(auVar220,auVar191);
        local_2b8[0] = (auVar238._0_4_ + 0.0) * 0.25 * local_518 + local_3c8;
        local_2b8[1] = (auVar238._4_4_ + 1.0) * 0.25 * local_518 + local_3c8;
        local_2b8[2] = (auVar238._8_4_ + 2.0) * 0.25 * local_518 + local_3c8;
        local_2b8[3] = (auVar238._12_4_ + 3.0) * 0.25 * local_518 + local_3c8;
        local_2c8._0_4_ = (auVar220._0_4_ + 0.0) * 0.25 * local_518 + local_3c8;
        local_2c8._4_4_ = (auVar220._4_4_ + 1.0) * 0.25 * local_518 + local_3c8;
        fStack_2c0 = (auVar220._8_4_ + 2.0) * 0.25 * local_518 + local_3c8;
        fStack_2bc = (auVar220._12_4_ + 3.0) * 0.25 * local_518 + local_3c8;
        local_548 = fVar153 - auVar72._0_4_ * auVar72._0_4_;
        fStack_544 = fVar171 - auVar72._4_4_ * auVar72._4_4_;
        fStack_540 = fVar172 - auVar72._8_4_ * auVar72._8_4_;
        fStack_53c = fVar173 - auVar72._12_4_ * auVar72._12_4_;
        auVar120._0_4_ = (float)local_508._0_4_ - local_168 * local_548;
        auVar120._4_4_ = (float)local_508._4_4_ - fStack_164 * fStack_544;
        auVar120._8_4_ = fStack_500 - fStack_160 * fStack_540;
        auVar120._12_4_ = fStack_4fc - fStack_15c * fStack_53c;
        local_3f8._4_4_ = -(uint)(0.0 <= auVar120._4_4_);
        local_3f8._0_4_ = -(uint)(0.0 <= auVar120._0_4_);
        fStack_3f0 = (float)-(uint)(0.0 <= auVar120._8_4_);
        fStack_3ec = (float)-(uint)(0.0 <= auVar120._12_4_);
        iVar45 = movmskps(iVar45,_local_3f8);
        if (iVar45 == 0) {
          fVar225 = 0.0;
          fVar235 = 0.0;
          fVar236 = 0.0;
          fVar241 = 0.0;
          fVar119 = 0.0;
          fVar180 = 0.0;
          fVar181 = 0.0;
          fVar133 = 0.0;
          fVar182 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar102 = 0.0;
          fVar116 = 0.0;
          fVar118 = 0.0;
          fVar131 = 0.0;
          fVar132 = 0.0;
          fVar134 = 0.0;
          fVar151 = 0.0;
          fVar152 = 0.0;
          _local_468 = ZEXT816(0);
          iVar45 = 0;
          auVar193 = _DAT_01feba00;
          auVar233 = _DAT_01feb9f0;
          local_548 = fVar153;
          fStack_544 = fVar171;
          fStack_540 = fVar172;
          fStack_53c = fVar173;
          fStack_4c4 = (float)local_558._0_4_;
          fStack_4c0 = (float)local_558._4_4_;
          fStack_4bc = fStack_550;
        }
        else {
          auVar238 = sqrtps(_local_2c8,auVar120);
          auVar109._0_4_ = local_328 + local_328;
          auVar109._4_4_ = fStack_324 + fStack_324;
          auVar109._8_4_ = fStack_320 + fStack_320;
          auVar109._12_4_ = fStack_31c + fStack_31c;
          auVar72 = rcpps(auVar120,auVar109);
          fVar248 = auVar72._0_4_;
          fVar249 = auVar72._4_4_;
          fVar250 = auVar72._8_4_;
          fVar251 = auVar72._12_4_;
          fVar248 = (fVar180 - auVar109._0_4_ * fVar248) * fVar248 + fVar248;
          fVar249 = (fVar181 - auVar109._4_4_ * fVar249) * fVar249 + fVar249;
          fVar250 = (fVar119 - auVar109._8_4_ * fVar250) * fVar250 + fVar250;
          fVar251 = (fVar133 - auVar109._12_4_ * fVar251) * fVar251 + fVar251;
          fVar252 = (-fVar132 - auVar238._0_4_) * fVar248;
          fVar253 = (-fVar134 - auVar238._4_4_) * fVar249;
          fVar254 = (-fVar151 - auVar238._8_4_) * fVar250;
          fVar257 = (-fVar152 - auVar238._12_4_) * fVar251;
          fVar248 = (auVar238._0_4_ - fVar132) * fVar248;
          fVar249 = (auVar238._4_4_ - fVar134) * fVar249;
          fVar250 = (auVar238._8_4_ - fVar151) * fVar250;
          fVar251 = (auVar238._12_4_ - fVar152) * fVar251;
          fVar153 = ((float)local_3e8._0_4_ * fVar252 + (float)local_2e8._0_4_) * local_178;
          fVar171 = ((float)local_3e8._4_4_ * fVar253 + (float)local_2e8._4_4_) * fStack_174;
          fVar172 = (fStack_3e0 * fVar254 + (float)local_2e8._8_4_) * fStack_170;
          fVar173 = (fStack_3dc * fVar257 + (float)local_2e8._12_4_) * fStack_16c;
          fVar102 = local_3a8 * fVar252 - ((float)local_3d8._0_4_ * fVar153 + local_5b8);
          fVar116 = fStack_3a4 * fVar253 - ((float)local_3d8._4_4_ * fVar171 + fStack_5b4);
          fVar118 = fStack_3a0 * fVar254 - (fStack_3d0 * fVar172 + fStack_5b0);
          fVar131 = fStack_39c * fVar257 - (fStack_3cc * fVar173 + fStack_5ac);
          local_5c8._4_4_ = fVar116;
          local_5c8._0_4_ = fVar102;
          fStack_5c0 = fVar118;
          fStack_5bc = fVar131;
          fVar132 = local_3b8 * fVar252 - ((float)local_358._0_4_ * fVar153 + fVar182);
          fVar134 = fStack_3b4 * fVar253 - ((float)local_358._4_4_ * fVar171 + fVar200);
          fVar151 = fStack_3b0 * fVar254 - ((float)local_358._8_4_ * fVar172 + fVar226);
          fVar152 = fStack_3ac * fVar257 - ((float)local_358._12_4_ * fVar173 + fVar242);
          local_468._4_4_ = fStack_394 * fVar253 - (fVar171 * fStack_384 + fVar224);
          local_468._0_4_ = local_398 * fVar252 - (fVar153 * local_388 + fVar198);
          fStack_460 = fStack_390 * fVar254 - (fVar172 * fStack_380 + fVar234);
          fStack_45c = fStack_38c * fVar257 - (fVar173 * fStack_37c + fVar243);
          fVar153 = ((float)local_3e8._0_4_ * fVar248 + (float)local_2e8._0_4_) * local_178;
          fVar171 = ((float)local_3e8._4_4_ * fVar249 + (float)local_2e8._4_4_) * fStack_174;
          fVar172 = (fStack_3e0 * fVar250 + (float)local_2e8._8_4_) * fStack_170;
          fVar173 = (fStack_3dc * fVar251 + (float)local_2e8._12_4_) * fStack_16c;
          fVar225 = local_3a8 * fVar248 - ((float)local_3d8._0_4_ * fVar153 + local_5b8);
          fVar235 = fStack_3a4 * fVar249 - ((float)local_3d8._4_4_ * fVar171 + fStack_5b4);
          fVar236 = fStack_3a0 * fVar250 - (fStack_3d0 * fVar172 + fStack_5b0);
          fVar241 = fStack_39c * fVar251 - (fStack_3cc * fVar173 + fStack_5ac);
          fVar119 = local_3b8 * fVar248 - ((float)local_358._0_4_ * fVar153 + fVar182);
          fVar180 = fStack_3b4 * fVar249 - ((float)local_358._4_4_ * fVar171 + fVar200);
          fVar181 = fStack_3b0 * fVar250 - ((float)local_358._8_4_ * fVar172 + fVar226);
          fVar133 = fStack_3ac * fVar251 - ((float)local_358._12_4_ * fVar173 + fVar242);
          bVar10 = 0.0 <= auVar120._0_4_;
          uVar57 = -(uint)bVar10;
          bVar56 = 0.0 <= auVar120._4_4_;
          uVar58 = -(uint)bVar56;
          bVar11 = 0.0 <= auVar120._8_4_;
          uVar59 = -(uint)bVar11;
          bVar12 = 0.0 <= auVar120._12_4_;
          uVar60 = -(uint)bVar12;
          fVar182 = local_398 * fVar248 - (fVar153 * local_388 + fVar198);
          fVar198 = fStack_394 * fVar249 - (fVar171 * fStack_384 + fVar224);
          fVar199 = fStack_390 * fVar250 - (fVar172 * fStack_380 + fVar234);
          fVar200 = fStack_38c * fVar251 - (fVar173 * fStack_37c + fVar243);
          auVar192._0_4_ = (uint)fVar252 & uVar57;
          auVar192._4_4_ = (uint)fVar253 & uVar58;
          auVar192._8_4_ = (uint)fVar254 & uVar59;
          auVar192._12_4_ = (uint)fVar257 & uVar60;
          auVar233._0_8_ = CONCAT44(~uVar58,~uVar57) & 0x7f8000007f800000;
          auVar233._8_4_ = ~uVar59 & 0x7f800000;
          auVar233._12_4_ = ~uVar60 & 0x7f800000;
          auVar233 = auVar233 | auVar192;
          auVar141._0_4_ = (uint)fVar248 & uVar57;
          auVar141._4_4_ = (uint)fVar249 & uVar58;
          auVar141._8_4_ = (uint)fVar250 & uVar59;
          auVar141._12_4_ = (uint)fVar251 & uVar60;
          auVar193._0_8_ = CONCAT44(~uVar58,~uVar57) & 0xff800000ff800000;
          auVar193._8_4_ = ~uVar59 & 0xff800000;
          auVar193._12_4_ = ~uVar60 & 0xff800000;
          auVar193 = auVar193 | auVar141;
          auVar89._0_8_ = (ulong)local_318 & 0x7fffffff7fffffff;
          auVar89._8_4_ = ABS(fStack_310);
          auVar89._12_4_ = ABS(fStack_30c);
          auVar28._4_4_ = fStack_294;
          auVar28._0_4_ = local_298;
          auVar28._8_4_ = fStack_290;
          auVar28._12_4_ = fStack_28c;
          auVar72 = maxps(auVar28,auVar89);
          fVar153 = auVar72._0_4_ * 1.9073486e-06;
          fVar171 = auVar72._4_4_ * 1.9073486e-06;
          fVar172 = auVar72._8_4_ * 1.9073486e-06;
          fVar173 = auVar72._12_4_ * 1.9073486e-06;
          auVar142._0_4_ = -(uint)(ABS(local_328) < fVar153 && bVar10);
          auVar142._4_4_ = -(uint)(ABS(fStack_324) < fVar171 && bVar56);
          auVar142._8_4_ = -(uint)(ABS(fStack_320) < fVar172 && bVar11);
          auVar142._12_4_ = -(uint)(ABS(fStack_31c) < fVar173 && bVar12);
          iVar45 = movmskps(iVar45,auVar142);
          local_538 = auVar263;
          _local_508 = auVar120;
          local_4c8 = fVar132;
          fStack_4c4 = fVar134;
          fStack_4c0 = fVar151;
          fStack_4bc = fVar152;
          if (iVar45 != 0) {
            uVar57 = -(uint)(local_548 <= 0.0);
            uVar58 = -(uint)(fStack_544 <= 0.0);
            uVar59 = -(uint)(fStack_540 <= 0.0);
            uVar60 = -(uint)(fStack_53c <= 0.0);
            auVar246._0_4_ = (uVar57 & 0xff800000 | ~uVar57 & 0x7f800000) & auVar142._0_4_;
            auVar246._4_4_ = (uVar58 & 0xff800000 | ~uVar58 & 0x7f800000) & auVar142._4_4_;
            auVar246._8_4_ = (uVar59 & 0xff800000 | ~uVar59 & 0x7f800000) & auVar142._8_4_;
            auVar246._12_4_ = (uVar60 & 0xff800000 | ~uVar60 & 0x7f800000) & auVar142._12_4_;
            auVar240._0_4_ = ~auVar142._0_4_ & auVar233._0_4_;
            auVar240._4_4_ = ~auVar142._4_4_ & auVar233._4_4_;
            auVar240._8_4_ = ~auVar142._8_4_ & auVar233._8_4_;
            auVar240._12_4_ = ~auVar142._12_4_ & auVar233._12_4_;
            auVar233 = auVar240 | auVar246;
            auVar247._0_4_ = (uVar57 & 0x7f800000 | ~uVar57 & 0xff800000) & auVar142._0_4_;
            auVar247._4_4_ = (uVar58 & 0x7f800000 | ~uVar58 & 0xff800000) & auVar142._4_4_;
            auVar247._8_4_ = (uVar59 & 0x7f800000 | ~uVar59 & 0xff800000) & auVar142._8_4_;
            auVar247._12_4_ = (uVar60 & 0x7f800000 | ~uVar60 & 0xff800000) & auVar142._12_4_;
            auVar150._0_4_ = ~auVar142._0_4_ & auVar193._0_4_;
            auVar150._4_4_ = ~auVar142._4_4_ & auVar193._4_4_;
            auVar150._8_4_ = ~auVar142._8_4_ & auVar193._8_4_;
            auVar150._12_4_ = ~auVar142._12_4_ & auVar193._12_4_;
            auVar193 = auVar150 | auVar247;
            local_3f8._4_4_ = -(uint)((fVar171 <= ABS(fStack_324) || fStack_544 <= 0.0) && bVar56);
            local_3f8._0_4_ = -(uint)((fVar153 <= ABS(local_328) || local_548 <= 0.0) && bVar10);
            fStack_3f0 = (float)-(uint)((fVar172 <= ABS(fStack_320) || fStack_540 <= 0.0) && bVar11)
            ;
            fStack_3ec = (float)-(uint)((fVar173 <= ABS(fStack_31c) || fStack_53c <= 0.0) && bVar12)
            ;
          }
        }
        fVar153 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar171 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar172 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_3d8._4_4_ =
             -(uint)(0.3 <= ABS(fVar235 * fVar153 + fVar180 * fVar171 + fVar198 * fVar172));
        local_3d8._0_4_ =
             -(uint)(0.3 <= ABS(fVar225 * fVar153 + fVar119 * fVar171 + fVar182 * fVar172));
        fStack_3d0 = (float)-(uint)(0.3 <= ABS(fVar236 * fVar153 +
                                               fVar181 * fVar171 + fVar199 * fVar172));
        fStack_3cc = (float)-(uint)(0.3 <= ABS(fVar241 * fVar153 +
                                               fVar133 * fVar171 + fVar200 * fVar172));
        _local_118 = local_378;
        local_108 = minps(local_198,auVar233);
        _local_1a8 = maxps(local_378,auVar193);
        local_2f8._0_4_ = -(uint)(fVar62 <= local_108._0_4_) & auVar263._0_4_;
        local_2f8._4_4_ = -(uint)(fVar100 <= local_108._4_4_) & auVar263._4_4_;
        local_2f8._8_4_ = -(uint)(fVar101 <= local_108._8_4_) & auVar263._8_4_;
        local_2f8._12_4_ = -(uint)(fVar117 <= local_108._12_4_) & auVar263._12_4_;
        _local_3e8 = _local_1a8;
        local_308._0_8_ =
             CONCAT44(-(uint)(local_1a8._4_4_ <= local_198._4_4_) & auVar263._4_4_,
                      -(uint)(local_1a8._0_4_ <= local_198._0_4_) & auVar263._0_4_);
        local_308._8_4_ = -(uint)(local_1a8._8_4_ <= local_198._8_4_) & auVar263._8_4_;
        local_308._12_4_ = -(uint)(local_1a8._12_4_ <= local_198._12_4_) & auVar263._12_4_;
        local_2e8 = local_308;
        auVar90._8_4_ = local_308._8_4_;
        auVar90._0_8_ = local_308._0_8_;
        auVar90._12_4_ = local_308._12_4_;
        iVar45 = movmskps(iVar45,auVar90 | local_2f8);
        if (iVar45 != 0) {
          _local_318 = local_2f8;
          local_328 = (float)(int)local_470;
          fStack_324 = (float)(int)local_470;
          fStack_320 = (float)(int)local_470;
          fStack_31c = (float)(int)local_470;
          local_468._0_4_ =
               -(uint)((int)local_470 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_468._0_4_ * fVar172 +
                                                 fVar132 * fVar171 + fVar102 * fVar153)) &
                             local_3f8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_468._4_4_ =
               -(uint)((int)local_470 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_468._4_4_ * fVar172 +
                                                 fVar134 * fVar171 + fVar116 * fVar153)) &
                             local_3f8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_460 = (float)-(uint)((int)local_470 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_460 * fVar172 +
                                                                fVar151 * fVar171 +
                                                                fVar118 * fVar153)) &
                                            (uint)fStack_3f0) << 0x1f) >> 0x1f) + 4);
          fStack_45c = (float)-(uint)((int)local_470 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_45c * fVar172 +
                                                                fVar152 * fVar171 +
                                                                fVar131 * fVar153)) &
                                            (uint)fStack_3ec) << 0x1f) >> 0x1f) + 4);
          local_2f8 = ~_local_468 & local_2f8;
          iVar45 = movmskps(iVar45,local_2f8);
          fStack_514 = local_518;
          fStack_510 = local_518;
          fStack_50c = local_518;
          local_4f8 = fStack_584;
          fStack_4f4 = fStack_580;
          fStack_4f0 = fStack_57c;
          if (iVar45 != 0) {
            local_388 = local_368 + fVar62;
            fStack_384 = fStack_364 + fVar100;
            fStack_380 = fStack_360 + fVar101;
            fStack_37c = fStack_35c + fVar117;
            do {
              auVar238 = ~local_2f8 & _DAT_01feb9f0 | local_2f8 & local_378;
              auVar143._4_4_ = auVar238._0_4_;
              auVar143._0_4_ = auVar238._4_4_;
              auVar143._8_4_ = auVar238._12_4_;
              auVar143._12_4_ = auVar238._8_4_;
              auVar72 = minps(auVar143,auVar238);
              auVar110._0_8_ = auVar72._8_8_;
              auVar110._8_4_ = auVar72._0_4_;
              auVar110._12_4_ = auVar72._4_4_;
              auVar72 = minps(auVar110,auVar72);
              auVar111._0_8_ =
                   CONCAT44(-(uint)(auVar72._4_4_ == auVar238._4_4_) & local_2f8._4_4_,
                            -(uint)(auVar72._0_4_ == auVar238._0_4_) & local_2f8._0_4_);
              auVar111._8_4_ = -(uint)(auVar72._8_4_ == auVar238._8_4_) & local_2f8._8_4_;
              auVar111._12_4_ = -(uint)(auVar72._12_4_ == auVar238._12_4_) & local_2f8._12_4_;
              iVar45 = movmskps(iVar45,auVar111);
              auVar91 = local_2f8;
              if (iVar45 != 0) {
                auVar91._8_4_ = auVar111._8_4_;
                auVar91._0_8_ = auVar111._0_8_;
                auVar91._12_4_ = auVar111._12_4_;
              }
              uVar46 = movmskps(iVar45,auVar91);
              pRVar49 = (RayHit *)0x0;
              if (CONCAT44(uVar51,uVar46) != 0) {
                for (; (CONCAT44(uVar51,uVar46) >> (long)pRVar49 & 1) == 0;
                    pRVar49 = (RayHit *)((long)(pRVar49->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_2f8 + (long)pRVar49 * 4) = 0;
              fVar117 = local_2b8[(long)pRVar49];
              fVar62 = *(float *)(local_118 + (long)pRVar49 * 4);
              pVVar1 = &(ray->super_RayK<1>).dir;
              fVar100 = (pVVar1->field_0).m128[0];
              fVar101 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar102 = (ray->super_RayK<1>).dir.field_0.m128[2];
              local_4e8 = (pVVar1->field_0).field_1;
              fVar100 = fVar102 * fVar102 + fVar101 * fVar101 + fVar100 * fVar100;
              if (fVar100 < 0.0) {
                fVar100 = sqrtf(fVar100);
                pRVar49 = extraout_RAX;
              }
              else {
                fVar100 = SQRT(fVar100);
              }
              fVar118 = 0.0;
              fVar116 = 0.0;
              fVar102 = 0.0;
              auVar18._4_4_ = fStack_4b4;
              auVar18._0_4_ = local_4b8;
              auVar18._8_4_ = fStack_4b0;
              auVar18._12_4_ = fStack_4ac;
              auVar24._4_4_ = fStack_434;
              auVar24._0_4_ = local_438;
              auVar24._8_4_ = fStack_430;
              auVar24._12_4_ = fStack_42c;
              auVar238 = minps(auVar18,auVar24);
              auVar220 = maxps(auVar18,auVar24);
              auVar22._4_4_ = fStack_444;
              auVar22._0_4_ = local_448;
              auVar22._8_4_ = fStack_440;
              auVar22._12_4_ = fStack_43c;
              auVar20._4_4_ = fStack_454;
              auVar20._0_4_ = local_458;
              auVar20._8_4_ = fStack_450;
              auVar20._12_4_ = fStack_44c;
              auVar72 = minps(auVar22,auVar20);
              auVar238 = minps(auVar238,auVar72);
              auVar72 = maxps(auVar22,auVar20);
              auVar72 = maxps(auVar220,auVar72);
              auVar162._0_8_ = auVar238._0_8_ & 0x7fffffff7fffffff;
              auVar162._8_4_ = auVar238._8_4_ & 0x7fffffff;
              auVar162._12_4_ = auVar238._12_4_ & 0x7fffffff;
              local_358._4_4_ = auVar72._12_4_;
              auVar92._0_8_ = auVar72._0_8_ & 0x7fffffff7fffffff;
              auVar92._8_4_ = auVar72._8_4_ & 0x7fffffff;
              auVar92._12_4_ = local_358._4_4_ & 0x7fffffff;
              auVar72 = maxps(auVar162,auVar92);
              fVar101 = auVar72._4_4_;
              if (auVar72._4_4_ <= auVar72._0_4_) {
                fVar101 = auVar72._0_4_;
              }
              auVar163._8_8_ = auVar72._8_8_;
              auVar163._0_8_ = auVar72._8_8_;
              if (auVar72._8_4_ <= fVar101) {
                auVar163._0_4_ = fVar101;
              }
              local_538._4_12_ = auVar163._4_12_;
              local_538._0_4_ = auVar163._0_4_ * 1.9073486e-06;
              local_508._0_4_ = fVar100 * 1.9073486e-06;
              local_358._0_4_ = local_358._4_4_;
              local_358._8_4_ = local_358._4_4_;
              local_358._12_4_ = local_358._4_4_;
              lVar55 = 4;
              do {
                fVar152 = 1.0 - fVar117;
                _local_5c8 = ZEXT416((uint)fVar152);
                fVar101 = fVar117 * fVar117;
                fVar100 = fVar117 * 3.0;
                local_588 = fVar100 + -5.0;
                _local_598 = ZEXT416((uint)(fVar152 * fVar152));
                fVar151 = -fVar117 * fVar152 * fVar152 * 0.5;
                fVar131 = (fVar101 * local_588 + 2.0) * 0.5;
                fVar132 = ((fVar152 * 3.0 + -5.0) * fVar152 * fVar152 + 2.0) * 0.5;
                fVar134 = -fVar152 * fVar117 * fVar117 * 0.5;
                local_4c8 = fVar151 * local_4b8 +
                            fVar131 * local_438 + fVar132 * local_448 + fVar134 * local_458;
                fStack_4c4 = fVar151 * fStack_4b4 +
                             fVar131 * fStack_434 + fVar132 * fStack_444 + fVar134 * fStack_454;
                fStack_4c0 = fVar151 * fStack_4b0 +
                             fVar131 * fStack_430 + fVar132 * fStack_440 + fVar134 * fStack_450;
                fStack_4bc = fVar151 * fStack_4ac +
                             fVar131 * fStack_42c + fVar132 * fStack_43c + fVar134 * fStack_44c;
                _local_5a8 = ZEXT416((uint)(fVar152 * -2.0));
                local_578 = fVar117 * -9.0 + 4.0;
                _local_558 = ZEXT416((uint)(fVar100 + -1.0));
                local_548 = (fVar62 * local_4e8.x + 0.0) - local_4c8;
                fStack_544 = (fVar62 * local_4e8.y + 0.0) - fStack_4c4;
                fStack_540 = (fVar62 * local_4e8.z + 0.0) - fStack_4c0;
                fStack_53c = (fVar62 * local_4e8.field_3.w + 0.0) - fStack_4bc;
                fVar131 = fStack_544 * fStack_544;
                fStack_5b0 = fStack_540 * fStack_540;
                fStack_5ac = fStack_53c * fStack_53c;
                local_5b8 = fVar131 + local_548 * local_548 + fStack_5b0;
                fStack_5b4 = fVar131 + fVar131 + fStack_5ac;
                fStack_5b0 = fVar131 + fStack_5b0 + fStack_5b0;
                fStack_5ac = fVar131 + fStack_5ac + fStack_5ac;
                local_348 = local_5b8;
                fStack_584 = fVar102;
                fStack_580 = fVar116;
                fStack_57c = fVar118;
                fStack_574 = fVar102;
                fStack_570 = fVar116;
                fStack_56c = fVar118;
                if (local_5b8 < 0.0) {
                  _local_528 = ZEXT416((uint)(fVar117 * 9.0));
                  local_518 = fVar101;
                  fStack_514 = fVar102;
                  fStack_510 = fVar116;
                  fStack_50c = fVar118;
                  local_4f8 = fVar100;
                  fStack_4f4 = fVar102;
                  fStack_4f0 = fVar116;
                  fStack_4ec = fVar118;
                  fVar132 = sqrtf(local_5b8);
                  pRVar50 = extraout_RAX_00;
                  fVar131 = (float)local_528._0_4_;
                  fVar100 = local_4f8;
                  fVar101 = local_518;
                }
                else {
                  fVar132 = SQRT(local_5b8);
                  pRVar50 = pRVar49;
                  fVar131 = fVar117 * 9.0;
                }
                fVar151 = (fVar117 * ((float)local_5c8._0_4_ + (float)local_5c8._0_4_) -
                          (float)local_598._0_4_) * 0.5;
                fVar134 = ((fVar117 + fVar117) * local_588 + fVar117 * fVar100) * 0.5;
                fVar152 = ((fVar100 + 2.0) * ((float)local_5c8._0_4_ + (float)local_5c8._0_4_) +
                          (float)local_5c8._0_4_ * -3.0 * (float)local_5c8._0_4_) * 0.5;
                fVar100 = ((float)local_5a8._0_4_ * fVar117 + fVar101) * 0.5;
                local_5c8._0_4_ =
                     fVar151 * local_4b8 +
                     fVar134 * local_438 + fVar152 * local_448 + fVar100 * local_458;
                local_5c8._4_4_ =
                     fVar151 * fStack_4b4 +
                     fVar134 * fStack_434 + fVar152 * fStack_444 + fVar100 * fStack_454;
                fStack_5c0 = fVar151 * fStack_4b0 +
                             fVar134 * fStack_430 + fVar152 * fStack_440 + fVar100 * fStack_450;
                fStack_5bc = fVar151 * fStack_4ac +
                             fVar134 * fStack_42c + fVar152 * fStack_43c + fVar100 * fStack_44c;
                fVar100 = fVar117 * -3.0 + 2.0;
                fVar131 = fVar131 + -5.0;
                fVar152 = (float)local_558._0_4_ * fStack_44c;
                fVar101 = fVar100 * local_4b8 +
                          fVar131 * local_438 +
                          local_578 * local_448 + (float)local_558._0_4_ * local_458;
                fVar134 = fVar100 * fStack_4b4 +
                          fVar131 * fStack_434 +
                          local_578 * fStack_444 + (float)local_558._0_4_ * fStack_454;
                fVar151 = fVar100 * fStack_4b0 +
                          fVar131 * fStack_430 +
                          local_578 * fStack_440 + (float)local_558._0_4_ * fStack_450;
                _local_558 = local_538;
                if (local_538._0_4_ <= (float)local_508._0_4_ * fVar62) {
                  register0x000013c4 = local_538._4_12_;
                  local_558._0_4_ = (float)local_508._0_4_ * fVar62;
                }
                fVar153 = (float)local_5c8._4_4_ * (float)local_5c8._4_4_ +
                          (float)local_5c8._0_4_ * (float)local_5c8._0_4_ + fStack_5c0 * fStack_5c0;
                auVar238 = ZEXT416((uint)fVar153);
                auVar72 = rsqrtss(ZEXT416((uint)fVar153),auVar238);
                fVar171 = auVar72._0_4_;
                fVar172 = fVar171 * fVar171 * fVar153 * -0.5 * fVar171 + fVar171 * 1.5;
                fVar171 = fVar151 * fStack_5c0 +
                          fVar134 * (float)local_5c8._4_4_ + fVar101 * (float)local_5c8._0_4_;
                auVar72 = rcpss(auVar238,auVar238);
                fVar173 = (2.0 - fVar153 * auVar72._0_4_) * auVar72._0_4_;
                local_5a8._0_4_ =
                     fVar173 * (fVar153 * fVar101 - fVar171 * (float)local_5c8._0_4_) * fVar172;
                local_5a8._4_4_ =
                     fVar173 * (fVar153 * fVar134 - fVar171 * (float)local_5c8._4_4_) * fVar172;
                fStack_5a0 = fVar173 * (fVar153 * fVar151 - fVar171 * fStack_5c0) * fVar172;
                if (fVar153 < 0.0) {
                  local_598._4_4_ = (float)local_5c8._4_4_ * fVar172;
                  local_598._0_4_ = (float)local_5c8._0_4_ * fVar172;
                  fStack_590 = fStack_5c0 * fVar172;
                  fStack_58c = fStack_5bc * fVar172;
                  fStack_59c = fVar173 * (fVar153 * (fVar100 * fStack_4ac +
                                                    fVar131 * fStack_42c +
                                                    local_578 * fStack_43c + fVar152) -
                                         fVar171 * fStack_5bc) * fVar172;
                  local_588 = -(float)local_5c8._0_4_;
                  fStack_584 = -(float)local_5c8._4_4_;
                  fStack_580 = -fStack_5c0;
                  fStack_57c = -fStack_5bc;
                  local_578 = fVar132;
                  fVar153 = sqrtf(fVar153);
                  pRVar50 = extraout_RAX_01;
                  fVar100 = local_588;
                  fVar101 = fStack_584;
                  fVar131 = fStack_580;
                  fVar134 = fStack_57c;
                  fVar132 = local_578;
                  fVar151 = (float)local_598._0_4_;
                  fVar152 = (float)local_598._4_4_;
                  fVar171 = fStack_590;
                  fVar172 = fStack_58c;
                }
                else {
                  fVar153 = SQRT(fVar153);
                  fVar100 = -(float)local_5c8._0_4_;
                  fVar101 = -(float)local_5c8._4_4_;
                  fVar131 = -fStack_5c0;
                  fVar134 = -fStack_5bc;
                  fVar151 = (float)local_5c8._0_4_ * fVar172;
                  fVar152 = (float)local_5c8._4_4_ * fVar172;
                  fVar171 = fStack_5c0 * fVar172;
                  fVar172 = fStack_5bc * fVar172;
                }
                fVar119 = fStack_544 * fVar152;
                fVar180 = fStack_540 * fVar171;
                fVar181 = fStack_53c * fVar172;
                fVar173 = fVar119 + local_548 * fVar151 + fVar180;
                fVar133 = fVar119 + fVar119 + fVar181;
                fVar180 = fVar119 + fVar180 + fVar180;
                fVar181 = fVar119 + fVar181 + fVar181;
                fVar132 = (fVar132 + 1.0) * ((float)local_538._0_4_ / fVar153) +
                          fVar132 * (float)local_538._0_4_ + local_558._0_4_;
                fVar119 = fVar172 * fVar134;
                fVar153 = fVar171 * fVar131 + fVar152 * fVar101 + fVar151 * fVar100 +
                          fStack_5a0 * fStack_540 +
                          (float)local_5a8._4_4_ * fStack_544 + (float)local_5a8._0_4_ * local_548;
                local_5a8._0_4_ =
                     local_4e8.z * fVar171 + local_4e8.y * fVar152 + local_4e8.x * fVar151;
                auVar164._4_4_ = fStack_5b4;
                auVar164._0_4_ = local_5b8;
                auVar164._8_4_ = fStack_5b0;
                auVar164._12_4_ = fStack_5ac;
                fVar151 = local_5b8 - fVar173 * fVar173;
                auVar93._0_8_ = CONCAT44(fStack_5b4 - fVar133 * fVar133,fVar151);
                auVar93._8_4_ = fStack_5b0 - fVar180 * fVar180;
                auVar93._12_4_ = fStack_5ac - fVar181 * fVar181;
                fVar134 = fVar134 * fStack_53c;
                fVar100 = (fVar131 * fStack_540 + fVar101 * fStack_544 + fVar100 * local_548) -
                          fVar173 * fVar153;
                fStack_4f0 = local_4e8.z * fStack_540;
                fStack_4f4 = local_4e8.field_3.w * fStack_53c;
                local_5a8._4_4_ = local_4e8.field_3.w * fVar172;
                fStack_5a0 = local_4e8.z * fVar171;
                fStack_59c = local_4e8.field_3.w * fVar172;
                local_4f8 = (fStack_4f0 + local_4e8.y * fStack_544 + local_4e8.x * local_548) -
                            fVar173 * (float)local_5a8._0_4_;
                auVar144._8_4_ = auVar93._8_4_;
                auVar144._0_8_ = auVar93._0_8_;
                auVar144._12_4_ = auVar93._12_4_;
                auVar72 = rsqrtss(auVar144,auVar93);
                fVar101 = auVar72._0_4_;
                auVar145._4_12_ = auVar72._4_12_;
                auVar145._0_4_ = fVar101 * fVar101 * fVar151 * -0.5 * fVar101 + fVar101 * 1.5;
                fStack_4ec = fStack_4f4;
                if (fVar151 < 0.0) {
                  local_598._4_4_ = fVar119;
                  local_598._0_4_ = fVar153;
                  fStack_590 = fVar171 * fVar131;
                  fStack_58c = fVar119;
                  local_588 = fVar100;
                  fStack_584 = fVar134;
                  fStack_580 = fVar131 * fStack_540;
                  fStack_57c = fVar134;
                  local_578 = fVar132;
                  _local_528 = auVar145;
                  local_518 = fVar173;
                  fStack_514 = fVar133;
                  fStack_510 = fVar180;
                  fStack_50c = fVar181;
                  fVar151 = sqrtf(fVar151);
                  auVar164._4_4_ = fStack_5b4;
                  auVar164._0_4_ = local_5b8;
                  auVar164._8_4_ = fStack_5b0;
                  auVar164._12_4_ = fStack_5ac;
                  pRVar50 = extraout_RAX_02;
                  auVar145 = _local_528;
                  fVar100 = local_588;
                  fVar134 = fStack_584;
                  fVar173 = local_518;
                  fVar132 = local_578;
                  fVar153 = (float)local_598._0_4_;
                  fVar119 = (float)local_598._4_4_;
                }
                else {
                  fVar151 = SQRT(fVar151);
                }
                fVar151 = fVar151 - fStack_4bc;
                fVar100 = fVar100 * auVar145._0_4_ - fStack_5bc;
                auVar16._4_4_ = fStack_4f4;
                auVar16._0_4_ = local_4f8;
                auVar16._8_4_ = fStack_4f0;
                auVar16._12_4_ = fStack_4ec;
                auVar121._4_12_ = auVar16._4_12_;
                auVar121._0_4_ = local_4f8 * auVar145._0_4_;
                auVar195._0_8_ = CONCAT44(fVar134,fVar100) ^ 0x8000000080000000;
                auVar195._8_4_ = -fVar134;
                auVar195._12_4_ = fVar119;
                auVar194._8_8_ = auVar195._8_8_;
                auVar194._0_8_ = CONCAT44(fVar153,fVar100) ^ 0x80000000;
                auVar271._0_4_ = fVar153 * auVar121._0_4_ - (float)local_5a8._0_4_ * fVar100;
                auVar123._0_8_ = auVar121._0_8_;
                auVar123._8_4_ = fStack_4f4;
                auVar123._12_4_ = local_5a8._4_4_ ^ 0x80000000;
                auVar122._8_8_ = auVar123._8_8_;
                auVar122._0_8_ = CONCAT44(local_5a8._0_4_,auVar121._0_4_) ^ 0x8000000000000000;
                auVar271._4_4_ = auVar271._0_4_;
                auVar271._8_4_ = auVar271._0_4_;
                auVar271._12_4_ = auVar271._0_4_;
                auVar72 = divps(auVar122,auVar271);
                auVar238 = divps(auVar194,auVar271);
                fVar117 = fVar117 - (auVar72._4_4_ * fVar151 + auVar72._0_4_ * fVar173);
                fVar62 = fVar62 - (auVar238._4_4_ * fVar151 + auVar238._0_4_ * fVar173);
                if (fVar132 <= ABS(fVar173)) {
                  bVar10 = false;
                }
                else if ((float)local_358._0_4_ * 1.9073486e-06 + local_558._0_4_ + fVar132 <=
                         ABS(fVar151)) {
                  bVar10 = false;
                }
                else {
                  fVar62 = fVar62 + (float)local_2d8._0_4_;
                  bVar10 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar62) &&
                       (fVar100 = (ray->super_RayK<1>).tfar, fVar62 <= fVar100)) && (0.0 <= fVar117)
                      ) && (fVar117 <= 1.0)) {
                    auVar72 = rsqrtss(auVar164,auVar164);
                    fVar101 = auVar72._0_4_;
                    pGVar8 = (context->scene->geometries).items[(long)local_560].ptr;
                    uVar57 = (ray->super_RayK<1>).mask;
                    pRVar50 = (RayHit *)(ulong)uVar57;
                    pRVar53 = local_560;
                    if ((pGVar8->mask & uVar57) != 0) {
                      fVar101 = fVar101 * 1.5 + fVar101 * fVar101 * local_348 * -0.5 * fVar101;
                      fVar151 = local_548 * fVar101;
                      fVar153 = fStack_544 * fVar101;
                      fVar101 = fStack_540 * fVar101;
                      fVar132 = fStack_5bc * fVar151 + (float)local_5c8._0_4_;
                      fVar131 = fStack_5bc * fVar153 + (float)local_5c8._4_4_;
                      fVar134 = fStack_5bc * fVar101 + fStack_5c0;
                      fVar152 = fVar153 * (float)local_5c8._0_4_ - (float)local_5c8._4_4_ * fVar151;
                      fVar153 = fVar101 * (float)local_5c8._4_4_ - fStack_5c0 * fVar153;
                      fVar151 = fVar151 * fStack_5c0 - (float)local_5c8._0_4_ * fVar101;
                      fVar101 = fVar131 * fVar153 - fVar151 * fVar132;
                      fVar131 = fVar134 * fVar151 - fVar152 * fVar131;
                      fVar132 = fVar132 * fVar152 - fVar153 * fVar134;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar62;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar132,fVar131);
                        (ray->Ng).field_0.field_0.z = fVar101;
                        ray->u = fVar117;
                        ray->v = 0.0;
                        ray->primID = (uint)local_4d0;
                        ray->geomID = (uint)local_560;
                        ray->instID[0] = context->user->instID[0];
                        uVar57 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar57;
                        pRVar50 = (RayHit *)(ulong)uVar57;
                      }
                      else {
                        local_428 = CONCAT44(fVar132,fVar131);
                        fStack_420 = fVar101;
                        fStack_41c = fVar117;
                        local_418 = 0;
                        local_414 = (uint)local_4d0;
                        local_410 = (uint)local_560;
                        local_40c = context->user->instID[0];
                        pRVar53 = (RTCIntersectArguments *)(ulong)local_40c;
                        local_408 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar62;
                        local_5cc = 0xffffffff;
                        local_4a8.geometryUserPtr = pGVar8->userPtr;
                        local_4a8.valid = &local_5cc;
                        local_4a8.context = context->user;
                        local_4a8.hit = (RTCHitN *)&local_428;
                        local_4a8.N = 1;
                        local_5b8 = fVar100;
                        local_4a8.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b56d0d:
                          pRVar53 = context->args;
                          if (pRVar53->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar53->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar53->filter)(&local_4a8);
                            }
                            if ((((RayK<1> *)local_4a8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00b56dbf;
                          }
                          (((Vec3f *)((long)local_4a8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4a8.hit;
                          (((Vec3f *)((long)local_4a8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4a8.hit + 4);
                          (((Vec3f *)((long)local_4a8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4a8.hit + 8);
                          *(float *)((long)local_4a8.ray + 0x3c) = *(float *)(local_4a8.hit + 0xc);
                          *(float *)((long)local_4a8.ray + 0x40) = *(float *)(local_4a8.hit + 0x10);
                          *(float *)((long)local_4a8.ray + 0x44) = *(float *)(local_4a8.hit + 0x14);
                          *(float *)((long)local_4a8.ray + 0x48) = *(float *)(local_4a8.hit + 0x18);
                          *(float *)((long)local_4a8.ray + 0x4c) = *(float *)(local_4a8.hit + 0x1c);
                          pRVar53 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4a8.hit + 0x20);
                          *(float *)((long)local_4a8.ray + 0x50) = *(float *)(local_4a8.hit + 0x20);
                          pRVar50 = (RayHit *)local_4a8.ray;
                        }
                        else {
                          (*pGVar8->intersectionFilterN)(&local_4a8);
                          if ((((RayK<1> *)local_4a8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00b56d0d;
LAB_00b56dbf:
                          (ray->super_RayK<1>).tfar = local_5b8;
                          pRVar50 = (RayHit *)local_4a8.valid;
                        }
                      }
                    }
                  }
                }
                bVar56 = lVar55 == 0;
                lVar55 = lVar55 + -1;
                pRVar49 = (RayHit *)CONCAT71((int7)((ulong)pRVar50 >> 8),bVar56);
              } while ((!bVar10) && (!bVar56));
              fVar117 = (ray->super_RayK<1>).tfar;
              local_2f8._0_4_ = -(uint)(local_388 <= fVar117) & local_2f8._0_4_;
              local_2f8._4_4_ = -(uint)(fStack_384 <= fVar117) & local_2f8._4_4_;
              local_2f8._8_4_ = -(uint)(fStack_380 <= fVar117) & local_2f8._8_4_;
              local_2f8._12_4_ = -(uint)(fStack_37c <= fVar117) & local_2f8._12_4_;
              uVar51 = (undefined4)((ulong)pRVar50 >> 0x20);
              iVar45 = movmskps((int)pRVar49,local_2f8);
            } while (iVar45 != 0);
          }
          fVar117 = (ray->super_RayK<1>).tfar;
          local_3e8._0_4_ = -(uint)((float)local_3e8._0_4_ + local_368 <= fVar117) & local_2e8._0_4_
          ;
          local_3e8._4_4_ =
               -(uint)((float)local_3e8._4_4_ + fStack_364 <= fVar117) & local_2e8._4_4_;
          fStack_3e0 = (float)(-(uint)(fStack_3e0 + fStack_360 <= fVar117) & local_2e8._8_4_);
          fStack_3dc = (float)(-(uint)(fStack_3dc + fStack_35c <= fVar117) & local_2e8._12_4_);
          local_3d8._0_4_ =
               -(uint)((int)local_328 <
                      ((int)((local_3d8._0_4_ & local_3f8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_3d8._4_4_ =
               -(uint)((int)fStack_324 <
                      ((int)((local_3d8._4_4_ & local_3f8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_3d0 = (float)-(uint)((int)fStack_320 <
                                     ((int)(((uint)fStack_3d0 & (uint)fStack_3f0) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_3cc = (float)-(uint)((int)fStack_31c <
                                     ((int)(((uint)fStack_3cc & (uint)fStack_3ec) << 0x1f) >> 0x1f)
                                     + 4);
          local_308 = ~_local_3d8 & _local_3e8;
          iVar45 = movmskps(iVar45,local_308);
          if (iVar45 != 0) {
            local_378 = _local_1a8;
            local_388 = local_368 + (float)local_1a8._0_4_;
            fStack_384 = fStack_364 + (float)local_1a8._4_4_;
            fStack_380 = fStack_360 + fStack_1a0;
            fStack_37c = fStack_35c + fStack_19c;
            do {
              auVar238 = ~local_308 & _DAT_01feb9f0 | local_308 & local_378;
              auVar146._4_4_ = auVar238._0_4_;
              auVar146._0_4_ = auVar238._4_4_;
              auVar146._8_4_ = auVar238._12_4_;
              auVar146._12_4_ = auVar238._8_4_;
              auVar72 = minps(auVar146,auVar238);
              auVar112._0_8_ = auVar72._8_8_;
              auVar112._8_4_ = auVar72._0_4_;
              auVar112._12_4_ = auVar72._4_4_;
              auVar72 = minps(auVar112,auVar72);
              auVar113._0_8_ =
                   CONCAT44(-(uint)(auVar72._4_4_ == auVar238._4_4_) & local_308._4_4_,
                            -(uint)(auVar72._0_4_ == auVar238._0_4_) & local_308._0_4_);
              auVar113._8_4_ = -(uint)(auVar72._8_4_ == auVar238._8_4_) & local_308._8_4_;
              auVar113._12_4_ = -(uint)(auVar72._12_4_ == auVar238._12_4_) & local_308._12_4_;
              iVar45 = movmskps(iVar45,auVar113);
              auVar94 = local_308;
              if (iVar45 != 0) {
                auVar94._8_4_ = auVar113._8_4_;
                auVar94._0_8_ = auVar113._0_8_;
                auVar94._12_4_ = auVar113._12_4_;
              }
              uVar46 = movmskps(iVar45,auVar94);
              pRVar49 = (RayHit *)0x0;
              if (CONCAT44(uVar51,uVar46) != 0) {
                for (; (CONCAT44(uVar51,uVar46) >> (long)pRVar49 & 1) == 0;
                    pRVar49 = (RayHit *)((long)(pRVar49->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_308 + (long)pRVar49 * 4) = 0;
              fVar117 = local_2b8[(long)&pRVar49[-1].field_0x5c];
              fVar62 = *(float *)(local_198 + (long)pRVar49 * 4);
              pVVar1 = &(ray->super_RayK<1>).dir;
              fVar100 = (pVVar1->field_0).m128[0];
              fVar101 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar102 = (ray->super_RayK<1>).dir.field_0.m128[2];
              local_4e8 = (pVVar1->field_0).field_1;
              fVar100 = fVar102 * fVar102 + fVar101 * fVar101 + fVar100 * fVar100;
              if (fVar100 < 0.0) {
                fVar100 = sqrtf(fVar100);
                pRVar49 = extraout_RAX_03;
              }
              else {
                fVar100 = SQRT(fVar100);
              }
              fVar118 = 0.0;
              fVar116 = 0.0;
              fVar102 = 0.0;
              auVar19._4_4_ = fStack_4b4;
              auVar19._0_4_ = local_4b8;
              auVar19._8_4_ = fStack_4b0;
              auVar19._12_4_ = fStack_4ac;
              auVar25._4_4_ = fStack_434;
              auVar25._0_4_ = local_438;
              auVar25._8_4_ = fStack_430;
              auVar25._12_4_ = fStack_42c;
              auVar238 = minps(auVar19,auVar25);
              auVar220 = maxps(auVar19,auVar25);
              auVar23._4_4_ = fStack_444;
              auVar23._0_4_ = local_448;
              auVar23._8_4_ = fStack_440;
              auVar23._12_4_ = fStack_43c;
              auVar21._4_4_ = fStack_454;
              auVar21._0_4_ = local_458;
              auVar21._8_4_ = fStack_450;
              auVar21._12_4_ = fStack_44c;
              auVar72 = minps(auVar23,auVar21);
              auVar238 = minps(auVar238,auVar72);
              auVar72 = maxps(auVar23,auVar21);
              auVar72 = maxps(auVar220,auVar72);
              auVar165._0_8_ = auVar238._0_8_ & 0x7fffffff7fffffff;
              auVar165._8_4_ = auVar238._8_4_ & 0x7fffffff;
              auVar165._12_4_ = auVar238._12_4_ & 0x7fffffff;
              local_358._4_4_ = auVar72._12_4_;
              auVar95._0_8_ = auVar72._0_8_ & 0x7fffffff7fffffff;
              auVar95._8_4_ = auVar72._8_4_ & 0x7fffffff;
              auVar95._12_4_ = local_358._4_4_ & 0x7fffffff;
              auVar72 = maxps(auVar165,auVar95);
              fVar101 = auVar72._4_4_;
              if (auVar72._4_4_ <= auVar72._0_4_) {
                fVar101 = auVar72._0_4_;
              }
              auVar166._8_8_ = auVar72._8_8_;
              auVar166._0_8_ = auVar72._8_8_;
              if (auVar72._8_4_ <= fVar101) {
                auVar166._0_4_ = fVar101;
              }
              local_538._4_12_ = auVar166._4_12_;
              local_538._0_4_ = auVar166._0_4_ * 1.9073486e-06;
              local_508._0_4_ = fVar100 * 1.9073486e-06;
              local_358._0_4_ = local_358._4_4_;
              local_358._8_4_ = local_358._4_4_;
              local_358._12_4_ = local_358._4_4_;
              lVar55 = 4;
              do {
                fVar152 = 1.0 - fVar117;
                _local_5c8 = ZEXT416((uint)fVar152);
                fVar101 = fVar117 * fVar117;
                fVar100 = fVar117 * 3.0;
                local_588 = fVar100 + -5.0;
                _local_598 = ZEXT416((uint)(fVar152 * fVar152));
                fVar151 = -fVar117 * fVar152 * fVar152 * 0.5;
                fVar131 = (fVar101 * local_588 + 2.0) * 0.5;
                fVar132 = ((fVar152 * 3.0 + -5.0) * fVar152 * fVar152 + 2.0) * 0.5;
                fVar134 = -fVar152 * fVar117 * fVar117 * 0.5;
                local_4c8 = fVar151 * local_4b8 +
                            fVar131 * local_438 + fVar132 * local_448 + fVar134 * local_458;
                fStack_4c4 = fVar151 * fStack_4b4 +
                             fVar131 * fStack_434 + fVar132 * fStack_444 + fVar134 * fStack_454;
                fStack_4c0 = fVar151 * fStack_4b0 +
                             fVar131 * fStack_430 + fVar132 * fStack_440 + fVar134 * fStack_450;
                fStack_4bc = fVar151 * fStack_4ac +
                             fVar131 * fStack_42c + fVar132 * fStack_43c + fVar134 * fStack_44c;
                _local_5a8 = ZEXT416((uint)(fVar152 * -2.0));
                local_578 = fVar117 * -9.0 + 4.0;
                _local_558 = ZEXT416((uint)(fVar100 + -1.0));
                local_548 = (fVar62 * local_4e8.x + 0.0) - local_4c8;
                fStack_544 = (fVar62 * local_4e8.y + 0.0) - fStack_4c4;
                fStack_540 = (fVar62 * local_4e8.z + 0.0) - fStack_4c0;
                fStack_53c = (fVar62 * local_4e8.field_3.w + 0.0) - fStack_4bc;
                fVar131 = fStack_544 * fStack_544;
                fStack_5b0 = fStack_540 * fStack_540;
                fStack_5ac = fStack_53c * fStack_53c;
                local_5b8 = fVar131 + local_548 * local_548 + fStack_5b0;
                fStack_5b4 = fVar131 + fVar131 + fStack_5ac;
                fStack_5b0 = fVar131 + fStack_5b0 + fStack_5b0;
                fStack_5ac = fVar131 + fStack_5ac + fStack_5ac;
                local_348 = local_5b8;
                fStack_584 = fVar102;
                fStack_580 = fVar116;
                fStack_57c = fVar118;
                fStack_574 = fVar102;
                fStack_570 = fVar116;
                fStack_56c = fVar118;
                if (local_5b8 < 0.0) {
                  _local_528 = ZEXT416((uint)(fVar117 * 9.0));
                  local_518 = fVar101;
                  fStack_514 = fVar102;
                  fStack_510 = fVar116;
                  fStack_50c = fVar118;
                  local_4f8 = fVar100;
                  fStack_4f4 = fVar102;
                  fStack_4f0 = fVar116;
                  fStack_4ec = fVar118;
                  fVar132 = sqrtf(local_5b8);
                  pRVar50 = extraout_RAX_04;
                  fVar131 = (float)local_528._0_4_;
                  fVar100 = local_4f8;
                  fVar101 = local_518;
                }
                else {
                  fVar132 = SQRT(local_5b8);
                  pRVar50 = pRVar49;
                  fVar131 = fVar117 * 9.0;
                }
                fVar151 = (fVar117 * ((float)local_5c8._0_4_ + (float)local_5c8._0_4_) -
                          (float)local_598._0_4_) * 0.5;
                fVar134 = ((fVar117 + fVar117) * local_588 + fVar117 * fVar100) * 0.5;
                fVar152 = ((fVar100 + 2.0) * ((float)local_5c8._0_4_ + (float)local_5c8._0_4_) +
                          (float)local_5c8._0_4_ * -3.0 * (float)local_5c8._0_4_) * 0.5;
                fVar100 = ((float)local_5a8._0_4_ * fVar117 + fVar101) * 0.5;
                local_5c8._0_4_ =
                     fVar151 * local_4b8 +
                     fVar134 * local_438 + fVar152 * local_448 + fVar100 * local_458;
                local_5c8._4_4_ =
                     fVar151 * fStack_4b4 +
                     fVar134 * fStack_434 + fVar152 * fStack_444 + fVar100 * fStack_454;
                fStack_5c0 = fVar151 * fStack_4b0 +
                             fVar134 * fStack_430 + fVar152 * fStack_440 + fVar100 * fStack_450;
                fStack_5bc = fVar151 * fStack_4ac +
                             fVar134 * fStack_42c + fVar152 * fStack_43c + fVar100 * fStack_44c;
                fVar100 = fVar117 * -3.0 + 2.0;
                fVar131 = fVar131 + -5.0;
                fVar152 = (float)local_558._0_4_ * fStack_44c;
                fVar101 = fVar100 * local_4b8 +
                          fVar131 * local_438 +
                          local_578 * local_448 + (float)local_558._0_4_ * local_458;
                fVar134 = fVar100 * fStack_4b4 +
                          fVar131 * fStack_434 +
                          local_578 * fStack_444 + (float)local_558._0_4_ * fStack_454;
                fVar151 = fVar100 * fStack_4b0 +
                          fVar131 * fStack_430 +
                          local_578 * fStack_440 + (float)local_558._0_4_ * fStack_450;
                _local_558 = local_538;
                if (local_538._0_4_ <= (float)local_508._0_4_ * fVar62) {
                  register0x000013c4 = local_538._4_12_;
                  local_558._0_4_ = (float)local_508._0_4_ * fVar62;
                }
                fVar153 = (float)local_5c8._4_4_ * (float)local_5c8._4_4_ +
                          (float)local_5c8._0_4_ * (float)local_5c8._0_4_ + fStack_5c0 * fStack_5c0;
                auVar238 = ZEXT416((uint)fVar153);
                auVar72 = rsqrtss(ZEXT416((uint)fVar153),auVar238);
                fVar171 = auVar72._0_4_;
                fVar172 = fVar171 * fVar171 * fVar153 * -0.5 * fVar171 + fVar171 * 1.5;
                fVar171 = fVar151 * fStack_5c0 +
                          fVar134 * (float)local_5c8._4_4_ + fVar101 * (float)local_5c8._0_4_;
                auVar72 = rcpss(auVar238,auVar238);
                fVar173 = (2.0 - fVar153 * auVar72._0_4_) * auVar72._0_4_;
                local_5a8._0_4_ =
                     fVar173 * (fVar153 * fVar101 - fVar171 * (float)local_5c8._0_4_) * fVar172;
                local_5a8._4_4_ =
                     fVar173 * (fVar153 * fVar134 - fVar171 * (float)local_5c8._4_4_) * fVar172;
                fStack_5a0 = fVar173 * (fVar153 * fVar151 - fVar171 * fStack_5c0) * fVar172;
                if (fVar153 < 0.0) {
                  local_598._4_4_ = (float)local_5c8._4_4_ * fVar172;
                  local_598._0_4_ = (float)local_5c8._0_4_ * fVar172;
                  fStack_590 = fStack_5c0 * fVar172;
                  fStack_58c = fStack_5bc * fVar172;
                  fStack_59c = fVar173 * (fVar153 * (fVar100 * fStack_4ac +
                                                    fVar131 * fStack_42c +
                                                    local_578 * fStack_43c + fVar152) -
                                         fVar171 * fStack_5bc) * fVar172;
                  local_588 = -(float)local_5c8._0_4_;
                  fStack_584 = -(float)local_5c8._4_4_;
                  fStack_580 = -fStack_5c0;
                  fStack_57c = -fStack_5bc;
                  local_578 = fVar132;
                  fVar153 = sqrtf(fVar153);
                  pRVar50 = extraout_RAX_05;
                  fVar100 = local_588;
                  fVar101 = fStack_584;
                  fVar131 = fStack_580;
                  fVar134 = fStack_57c;
                  fVar132 = local_578;
                  fVar151 = (float)local_598._0_4_;
                  fVar152 = (float)local_598._4_4_;
                  fVar171 = fStack_590;
                  fVar172 = fStack_58c;
                }
                else {
                  fVar153 = SQRT(fVar153);
                  fVar100 = -(float)local_5c8._0_4_;
                  fVar101 = -(float)local_5c8._4_4_;
                  fVar131 = -fStack_5c0;
                  fVar134 = -fStack_5bc;
                  fVar151 = (float)local_5c8._0_4_ * fVar172;
                  fVar152 = (float)local_5c8._4_4_ * fVar172;
                  fVar171 = fStack_5c0 * fVar172;
                  fVar172 = fStack_5bc * fVar172;
                }
                fVar119 = fStack_544 * fVar152;
                fVar180 = fStack_540 * fVar171;
                fVar181 = fStack_53c * fVar172;
                fVar173 = fVar119 + local_548 * fVar151 + fVar180;
                fVar133 = fVar119 + fVar119 + fVar181;
                fVar180 = fVar119 + fVar180 + fVar180;
                fVar181 = fVar119 + fVar181 + fVar181;
                fVar132 = (fVar132 + 1.0) * ((float)local_538._0_4_ / fVar153) +
                          fVar132 * (float)local_538._0_4_ + local_558._0_4_;
                fVar119 = fVar172 * fVar134;
                fVar153 = fVar171 * fVar131 + fVar152 * fVar101 + fVar151 * fVar100 +
                          fStack_5a0 * fStack_540 +
                          (float)local_5a8._4_4_ * fStack_544 + (float)local_5a8._0_4_ * local_548;
                local_5a8._0_4_ =
                     local_4e8.z * fVar171 + local_4e8.y * fVar152 + local_4e8.x * fVar151;
                auVar167._4_4_ = fStack_5b4;
                auVar167._0_4_ = local_5b8;
                auVar167._8_4_ = fStack_5b0;
                auVar167._12_4_ = fStack_5ac;
                fVar151 = local_5b8 - fVar173 * fVar173;
                auVar96._0_8_ = CONCAT44(fStack_5b4 - fVar133 * fVar133,fVar151);
                auVar96._8_4_ = fStack_5b0 - fVar180 * fVar180;
                auVar96._12_4_ = fStack_5ac - fVar181 * fVar181;
                fVar134 = fVar134 * fStack_53c;
                fVar100 = (fVar131 * fStack_540 + fVar101 * fStack_544 + fVar100 * local_548) -
                          fVar173 * fVar153;
                fStack_4f0 = local_4e8.z * fStack_540;
                fStack_4f4 = local_4e8.field_3.w * fStack_53c;
                local_5a8._4_4_ = local_4e8.field_3.w * fVar172;
                fStack_5a0 = local_4e8.z * fVar171;
                fStack_59c = local_4e8.field_3.w * fVar172;
                local_4f8 = (fStack_4f0 + local_4e8.y * fStack_544 + local_4e8.x * local_548) -
                            fVar173 * (float)local_5a8._0_4_;
                auVar147._8_4_ = auVar96._8_4_;
                auVar147._0_8_ = auVar96._0_8_;
                auVar147._12_4_ = auVar96._12_4_;
                auVar72 = rsqrtss(auVar147,auVar96);
                fVar101 = auVar72._0_4_;
                auVar148._4_12_ = auVar72._4_12_;
                auVar148._0_4_ = fVar101 * fVar101 * fVar151 * -0.5 * fVar101 + fVar101 * 1.5;
                fStack_4ec = fStack_4f4;
                if (fVar151 < 0.0) {
                  local_598._4_4_ = fVar119;
                  local_598._0_4_ = fVar153;
                  fStack_590 = fVar171 * fVar131;
                  fStack_58c = fVar119;
                  local_588 = fVar100;
                  fStack_584 = fVar134;
                  fStack_580 = fVar131 * fStack_540;
                  fStack_57c = fVar134;
                  local_578 = fVar132;
                  _local_528 = auVar148;
                  local_518 = fVar173;
                  fStack_514 = fVar133;
                  fStack_510 = fVar180;
                  fStack_50c = fVar181;
                  fVar151 = sqrtf(fVar151);
                  auVar167._4_4_ = fStack_5b4;
                  auVar167._0_4_ = local_5b8;
                  auVar167._8_4_ = fStack_5b0;
                  auVar167._12_4_ = fStack_5ac;
                  pRVar50 = extraout_RAX_06;
                  auVar148 = _local_528;
                  fVar100 = local_588;
                  fVar134 = fStack_584;
                  fVar173 = local_518;
                  fVar132 = local_578;
                  fVar153 = (float)local_598._0_4_;
                  fVar119 = (float)local_598._4_4_;
                }
                else {
                  fVar151 = SQRT(fVar151);
                }
                fVar151 = fVar151 - fStack_4bc;
                fVar100 = fVar100 * auVar148._0_4_ - fStack_5bc;
                auVar17._4_4_ = fStack_4f4;
                auVar17._0_4_ = local_4f8;
                auVar17._8_4_ = fStack_4f0;
                auVar17._12_4_ = fStack_4ec;
                auVar124._4_12_ = auVar17._4_12_;
                auVar124._0_4_ = local_4f8 * auVar148._0_4_;
                auVar197._0_8_ = CONCAT44(fVar134,fVar100) ^ 0x8000000080000000;
                auVar197._8_4_ = -fVar134;
                auVar197._12_4_ = fVar119;
                auVar196._8_8_ = auVar197._8_8_;
                auVar196._0_8_ = CONCAT44(fVar153,fVar100) ^ 0x80000000;
                auVar272._0_4_ = fVar153 * auVar124._0_4_ - (float)local_5a8._0_4_ * fVar100;
                auVar126._0_8_ = auVar124._0_8_;
                auVar126._8_4_ = fStack_4f4;
                auVar126._12_4_ = local_5a8._4_4_ ^ 0x80000000;
                auVar125._8_8_ = auVar126._8_8_;
                auVar125._0_8_ = CONCAT44(local_5a8._0_4_,auVar124._0_4_) ^ 0x8000000000000000;
                auVar272._4_4_ = auVar272._0_4_;
                auVar272._8_4_ = auVar272._0_4_;
                auVar272._12_4_ = auVar272._0_4_;
                auVar72 = divps(auVar125,auVar272);
                auVar238 = divps(auVar196,auVar272);
                fVar117 = fVar117 - (auVar72._4_4_ * fVar151 + auVar72._0_4_ * fVar173);
                fVar62 = fVar62 - (auVar238._4_4_ * fVar151 + auVar238._0_4_ * fVar173);
                if (fVar132 <= ABS(fVar173)) {
                  bVar10 = false;
                }
                else if ((float)local_358._0_4_ * 1.9073486e-06 + local_558._0_4_ + fVar132 <=
                         ABS(fVar151)) {
                  bVar10 = false;
                }
                else {
                  fVar62 = fVar62 + (float)local_2d8._0_4_;
                  bVar10 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar62) &&
                       (fVar100 = (ray->super_RayK<1>).tfar, fVar62 <= fVar100)) && (0.0 <= fVar117)
                      ) && (fVar117 <= 1.0)) {
                    auVar72 = rsqrtss(auVar167,auVar167);
                    fVar101 = auVar72._0_4_;
                    pGVar8 = (context->scene->geometries).items[(long)local_560].ptr;
                    uVar57 = (ray->super_RayK<1>).mask;
                    pRVar50 = (RayHit *)(ulong)uVar57;
                    pRVar53 = local_560;
                    if ((pGVar8->mask & uVar57) != 0) {
                      fVar101 = fVar101 * 1.5 + fVar101 * fVar101 * local_348 * -0.5 * fVar101;
                      fVar151 = local_548 * fVar101;
                      fVar153 = fStack_544 * fVar101;
                      fVar101 = fStack_540 * fVar101;
                      fVar132 = fStack_5bc * fVar151 + (float)local_5c8._0_4_;
                      fVar131 = fStack_5bc * fVar153 + (float)local_5c8._4_4_;
                      fVar134 = fStack_5bc * fVar101 + fStack_5c0;
                      fVar152 = fVar153 * (float)local_5c8._0_4_ - (float)local_5c8._4_4_ * fVar151;
                      fVar153 = fVar101 * (float)local_5c8._4_4_ - fStack_5c0 * fVar153;
                      fVar151 = fVar151 * fStack_5c0 - (float)local_5c8._0_4_ * fVar101;
                      fVar101 = fVar131 * fVar153 - fVar151 * fVar132;
                      fVar131 = fVar134 * fVar151 - fVar152 * fVar131;
                      fVar132 = fVar132 * fVar152 - fVar153 * fVar134;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar62;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar132,fVar131);
                        (ray->Ng).field_0.field_0.z = fVar101;
                        ray->u = fVar117;
                        ray->v = 0.0;
                        ray->primID = (uint)local_4d0;
                        ray->geomID = (uint)local_560;
                        ray->instID[0] = context->user->instID[0];
                        uVar57 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar57;
                        pRVar50 = (RayHit *)(ulong)uVar57;
                      }
                      else {
                        local_428 = CONCAT44(fVar132,fVar131);
                        fStack_420 = fVar101;
                        fStack_41c = fVar117;
                        local_418 = 0;
                        local_414 = (uint)local_4d0;
                        local_410 = (uint)local_560;
                        local_40c = context->user->instID[0];
                        pRVar53 = (RTCIntersectArguments *)(ulong)local_40c;
                        local_408 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar62;
                        local_5cc = 0xffffffff;
                        local_4a8.geometryUserPtr = pGVar8->userPtr;
                        local_4a8.valid = &local_5cc;
                        local_4a8.context = context->user;
                        local_4a8.hit = (RTCHitN *)&local_428;
                        local_4a8.N = 1;
                        local_5b8 = fVar100;
                        local_4a8.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b5795a:
                          pRVar53 = context->args;
                          if (pRVar53->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar53->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar53->filter)(&local_4a8);
                            }
                            if ((((RayK<1> *)local_4a8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00b57a0c;
                          }
                          (((Vec3f *)((long)local_4a8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_4a8.hit;
                          (((Vec3f *)((long)local_4a8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_4a8.hit + 4);
                          (((Vec3f *)((long)local_4a8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_4a8.hit + 8);
                          *(float *)((long)local_4a8.ray + 0x3c) = *(float *)(local_4a8.hit + 0xc);
                          *(float *)((long)local_4a8.ray + 0x40) = *(float *)(local_4a8.hit + 0x10);
                          *(float *)((long)local_4a8.ray + 0x44) = *(float *)(local_4a8.hit + 0x14);
                          *(float *)((long)local_4a8.ray + 0x48) = *(float *)(local_4a8.hit + 0x18);
                          *(float *)((long)local_4a8.ray + 0x4c) = *(float *)(local_4a8.hit + 0x1c);
                          pRVar53 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_4a8.hit + 0x20);
                          *(float *)((long)local_4a8.ray + 0x50) = *(float *)(local_4a8.hit + 0x20);
                          pRVar50 = (RayHit *)local_4a8.ray;
                        }
                        else {
                          (*pGVar8->intersectionFilterN)(&local_4a8);
                          if ((((RayK<1> *)local_4a8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00b5795a;
LAB_00b57a0c:
                          (ray->super_RayK<1>).tfar = local_5b8;
                          pRVar50 = (RayHit *)local_4a8.valid;
                        }
                      }
                    }
                  }
                }
                bVar56 = lVar55 == 0;
                lVar55 = lVar55 + -1;
                pRVar49 = (RayHit *)CONCAT71((int7)((ulong)pRVar50 >> 8),bVar56);
              } while ((!bVar10) && (!bVar56));
              fVar117 = (ray->super_RayK<1>).tfar;
              local_308._0_4_ = -(uint)(local_388 <= fVar117) & local_308._0_4_;
              local_308._4_4_ = -(uint)(fStack_384 <= fVar117) & local_308._4_4_;
              local_308._8_4_ = -(uint)(fStack_380 <= fVar117) & local_308._8_4_;
              local_308._12_4_ = -(uint)(fStack_37c <= fVar117) & local_308._12_4_;
              uVar51 = (undefined4)((ulong)pRVar50 >> 0x20);
              iVar45 = movmskps((int)pRVar49,local_308);
            } while (iVar45 != 0);
          }
          fVar117 = (ray->super_RayK<1>).tfar;
          auVar168._0_4_ =
               local_468._0_4_ & local_318._0_4_ &
               -(uint)(local_368 + (float)local_118._0_4_ <= fVar117);
          auVar168._4_4_ =
               local_468._4_4_ & local_318._4_4_ &
               -(uint)(fStack_364 + (float)local_118._4_4_ <= fVar117);
          auVar168._8_4_ =
               (uint)fStack_460 & (uint)fStack_310 & -(uint)(fStack_360 + fStack_110 <= fVar117);
          auVar168._12_4_ =
               (uint)fStack_45c & (uint)fStack_30c & -(uint)(fStack_35c + fStack_10c <= fVar117);
          auVar127._0_4_ =
               local_3d8._0_4_ & local_3e8._0_4_ &
               -(uint)(local_368 + (float)local_1a8._0_4_ <= fVar117);
          auVar127._4_4_ =
               local_3d8._4_4_ & local_3e8._4_4_ &
               -(uint)(fStack_364 + (float)local_1a8._4_4_ <= fVar117);
          auVar127._8_4_ =
               (uint)fStack_3d0 & (uint)fStack_3e0 & -(uint)(fStack_360 + fStack_1a0 <= fVar117);
          auVar127._12_4_ =
               (uint)fStack_3cc & (uint)fStack_3dc & -(uint)(fStack_35c + fStack_19c <= fVar117);
          iVar45 = movmskps(iVar45,auVar127 | auVar168);
          if (iVar45 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar47 * 0xc) = auVar127 | auVar168;
            auVar97._0_4_ = local_118._0_4_ & auVar168._0_4_;
            auVar97._4_4_ = local_118._4_4_ & auVar168._4_4_;
            auVar97._8_4_ = (uint)fStack_110 & auVar168._8_4_;
            auVar97._12_4_ = (uint)fStack_10c & auVar168._12_4_;
            auVar169._0_4_ = ~auVar168._0_4_ & local_1a8._0_4_;
            auVar169._4_4_ = ~auVar168._4_4_ & local_1a8._4_4_;
            auVar169._8_4_ = ~auVar168._8_4_ & (uint)fStack_1a0;
            auVar169._12_4_ = ~auVar168._12_4_ & (uint)fStack_19c;
            *(undefined1 (*) [16])(afStack_e8 + uVar47 * 0xc) = auVar169 | auVar97;
            afStack_d0[uVar47 * 0xc + -2] = local_3c8;
            afStack_d0[uVar47 * 0xc + -1] = fStack_3c4;
            fVar117 = (float)((int)local_470 + 1);
            pRVar53 = (RTCIntersectArguments *)(ulong)(uint)fVar117;
            afStack_d0[uVar47 * 0xc] = fVar117;
            uVar54 = (ulong)((int)uVar47 + 1);
          }
        }
      }
    }
    fVar117 = (ray->super_RayK<1>).tfar;
    do {
      uVar57 = (uint)uVar54;
      if (uVar57 == 0) {
        fVar117 = (ray->super_RayK<1>).tfar;
        auVar115._4_4_ = -(uint)(fStack_184 <= fVar117);
        auVar115._0_4_ = -(uint)(local_188 <= fVar117);
        auVar115._8_4_ = -(uint)(fStack_180 <= fVar117);
        auVar115._12_4_ = -(uint)(fStack_17c <= fVar117);
        uVar57 = movmskps(0,auVar115);
        uVar57 = (uint)local_330 & uVar57;
        if (uVar57 == 0) {
          return;
        }
        goto LAB_00b5508e;
      }
      uVar54 = (ulong)(uVar57 - 1);
      local_4a8.valid._0_4_ =
           -(uint)(local_368 + afStack_e8[uVar54 * 0xc] <= fVar117) & auStack_f8[uVar54 * 0xc];
      local_4a8.valid._4_4_ =
           -(uint)(fStack_364 + afStack_e8[uVar54 * 0xc + 1] <= fVar117) &
           auStack_f8[uVar54 * 0xc + 1];
      local_4a8.geometryUserPtr._0_4_ =
           -(uint)(fStack_360 + afStack_e8[uVar54 * 0xc + 2] <= fVar117) &
           auStack_f8[uVar54 * 0xc + 2];
      local_4a8.geometryUserPtr._4_4_ =
           -(uint)(fStack_35c + afStack_e8[uVar54 * 0xc + 3] <= fVar117) &
           (uint)afStack_e8[uVar54 * 0xc + -1];
      uVar58 = movmskps((int)pRVar53,(undefined1  [16])local_4a8._0_16_);
      pRVar53 = (RTCIntersectArguments *)(ulong)uVar58;
      if (uVar58 != 0) {
        auVar128._0_4_ = (uint)afStack_e8[uVar54 * 0xc] & (uint)local_4a8.valid;
        auVar128._4_4_ = (uint)afStack_e8[uVar54 * 0xc + 1] & local_4a8.valid._4_4_;
        auVar128._8_4_ = (uint)afStack_e8[uVar54 * 0xc + 2] & (uint)local_4a8.geometryUserPtr;
        auVar128._12_4_ = (uint)afStack_e8[uVar54 * 0xc + 3] & local_4a8.geometryUserPtr._4_4_;
        auVar149._0_8_ =
             CONCAT44(~local_4a8.valid._4_4_,~(uint)local_4a8.valid) & 0x7f8000007f800000;
        auVar149._8_4_ = ~(uint)local_4a8.geometryUserPtr & 0x7f800000;
        auVar149._12_4_ = ~local_4a8.geometryUserPtr._4_4_ & 0x7f800000;
        auVar149 = auVar149 | auVar128;
        auVar170._4_4_ = auVar149._0_4_;
        auVar170._0_4_ = auVar149._4_4_;
        auVar170._8_4_ = auVar149._12_4_;
        auVar170._12_4_ = auVar149._8_4_;
        auVar72 = minps(auVar170,auVar149);
        auVar129._0_8_ = auVar72._8_8_;
        auVar129._8_4_ = auVar72._0_4_;
        auVar129._12_4_ = auVar72._4_4_;
        auVar72 = minps(auVar129,auVar72);
        auVar130._0_8_ =
             CONCAT44(-(uint)(auVar72._4_4_ == auVar149._4_4_) & local_4a8.valid._4_4_,
                      -(uint)(auVar72._0_4_ == auVar149._0_4_) & (uint)local_4a8.valid);
        auVar130._8_4_ = -(uint)(auVar72._8_4_ == auVar149._8_4_) & (uint)local_4a8.geometryUserPtr;
        auVar130._12_4_ =
             -(uint)(auVar72._12_4_ == auVar149._12_4_) & local_4a8.geometryUserPtr._4_4_;
        iVar45 = movmskps((int)lVar48,auVar130);
        auVar114 = (undefined1  [16])local_4a8._0_16_;
        if (iVar45 != 0) {
          auVar114._8_4_ = auVar130._8_4_;
          auVar114._0_8_ = auVar130._0_8_;
          auVar114._12_4_ = auVar130._12_4_;
        }
        fVar62 = afStack_d0[uVar54 * 0xc + -2];
        fVar100 = afStack_d0[uVar54 * 0xc + -1];
        local_470 = (ulong)(uint)afStack_d0[uVar54 * 0xc];
        uVar59 = movmskps(afStack_d0[uVar54 * 0xc],auVar114);
        lVar48 = 0;
        if (uVar59 != 0) {
          for (; (uVar59 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
          }
        }
        *(undefined4 *)((long)&local_4a8.valid + lVar48 * 4) = 0;
        *(undefined1 (*) [16])(auStack_f8 + uVar54 * 0xc) = (undefined1  [16])local_4a8._0_16_;
        iVar45 = movmskps((int)(undefined1 (*) [16])(auStack_f8 + uVar54 * 0xc),
                          (undefined1  [16])local_4a8._0_16_);
        if (iVar45 == 0) {
          uVar57 = uVar57 - 1;
        }
        fVar100 = fVar100 - fVar62;
        local_428 = CONCAT44(fVar100 * 0.33333334 + fVar62,fVar100 * 0.0 + fVar62);
        fStack_420 = fVar100 * 0.6666667 + fVar62;
        fStack_41c = fVar100 * 1.0 + fVar62;
        local_3c8 = *(float *)((long)&local_428 + lVar48 * 4);
        fStack_3c4 = *(float *)((long)&local_428 + lVar48 * 4 + 4);
        uStack_3c0 = 0;
        uStack_3bc = 0;
        uVar54 = (ulong)uVar57;
      }
      uVar47 = uVar54;
    } while ((char)uVar58 == '\0');
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }